

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateFunctionMapFactory.cpp
# Opt level: O0

ElementFunctionMap *
COLLADASaxFWL15::FunctionMapFactory::createFunctionMap__library_nodes__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ElementValidateEndFunctionPtr in_R9;
  code *pcVar3;
  key_type *in_stack_ffffffffffffc978;
  code *__k;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
  *in_stack_ffffffffffffc980;
  code *this;
  FunctionStruct local_32a8;
  code *local_3248;
  undefined8 uStack_3240;
  code *local_3238;
  undefined8 uStack_3230;
  code *local_3228;
  undefined8 uStack_3220;
  code *local_3218;
  undefined8 uStack_3210;
  code *local_3208;
  undefined8 local_3200;
  code *local_31f8;
  undefined8 local_31f0;
  FunctionStruct local_31e8;
  code *local_3188;
  undefined8 uStack_3180;
  code *local_3178;
  undefined8 uStack_3170;
  code *local_3168;
  undefined8 uStack_3160;
  code *local_3158;
  undefined8 uStack_3150;
  code *local_3148;
  undefined8 local_3140;
  code *local_3138;
  undefined8 local_3130;
  FunctionStruct local_3128;
  code *local_30c8;
  undefined8 uStack_30c0;
  code *local_30b8;
  undefined8 uStack_30b0;
  code *local_30a8;
  undefined8 uStack_30a0;
  code *local_3098;
  undefined8 uStack_3090;
  code *local_3088;
  undefined8 local_3080;
  code *local_3078;
  undefined8 local_3070;
  FunctionStruct local_3068;
  code *local_3008;
  undefined8 uStack_3000;
  code *local_2ff8;
  undefined8 uStack_2ff0;
  code *local_2fe8;
  undefined8 uStack_2fe0;
  code *local_2fd8;
  undefined8 uStack_2fd0;
  code *local_2fc8;
  undefined8 local_2fc0;
  code *local_2fb8;
  undefined8 local_2fb0;
  FunctionStruct local_2fa8;
  code *local_2f48;
  undefined8 uStack_2f40;
  code *local_2f38;
  undefined8 uStack_2f30;
  code *local_2f28;
  undefined8 uStack_2f20;
  code *local_2f18;
  undefined8 uStack_2f10;
  code *local_2f08;
  undefined8 local_2f00;
  code *local_2ef8;
  undefined8 local_2ef0;
  FunctionStruct local_2ee8;
  code *local_2e88;
  undefined8 uStack_2e80;
  code *local_2e78;
  undefined8 uStack_2e70;
  code *local_2e68;
  undefined8 uStack_2e60;
  code *local_2e58;
  undefined8 uStack_2e50;
  code *local_2e48;
  undefined8 local_2e40;
  code *local_2e38;
  undefined8 local_2e30;
  FunctionStruct local_2e28;
  code *local_2dc8;
  undefined8 uStack_2dc0;
  code *local_2db8;
  undefined8 uStack_2db0;
  code *local_2da8;
  undefined8 uStack_2da0;
  code *local_2d98;
  undefined8 uStack_2d90;
  code *local_2d88;
  undefined8 local_2d80;
  code *local_2d78;
  undefined8 local_2d70;
  FunctionStruct local_2d68;
  code *local_2d08;
  undefined8 uStack_2d00;
  code *local_2cf8;
  undefined8 uStack_2cf0;
  code *local_2ce8;
  undefined8 uStack_2ce0;
  code *local_2cd8;
  undefined8 uStack_2cd0;
  code *local_2cc8;
  undefined8 local_2cc0;
  code *local_2cb8;
  undefined8 local_2cb0;
  FunctionStruct local_2ca8;
  code *local_2c48;
  undefined8 uStack_2c40;
  code *local_2c38;
  undefined8 uStack_2c30;
  code *local_2c28;
  undefined8 uStack_2c20;
  code *local_2c18;
  undefined8 uStack_2c10;
  code *local_2c08;
  undefined8 local_2c00;
  code *local_2bf8;
  undefined8 local_2bf0;
  FunctionStruct local_2be8;
  code *local_2b88;
  undefined8 uStack_2b80;
  code *local_2b78;
  undefined8 uStack_2b70;
  code *local_2b68;
  undefined8 uStack_2b60;
  code *local_2b58;
  undefined8 uStack_2b50;
  code *local_2b48;
  undefined8 local_2b40;
  code *local_2b38;
  undefined8 local_2b30;
  FunctionStruct local_2b28;
  code *local_2ac8;
  undefined8 uStack_2ac0;
  code *local_2ab8;
  undefined8 uStack_2ab0;
  code *local_2aa8;
  undefined8 uStack_2aa0;
  code *local_2a98;
  undefined8 uStack_2a90;
  code *local_2a88;
  undefined8 local_2a80;
  code *local_2a78;
  undefined8 local_2a70;
  FunctionStruct local_2a68;
  code *local_2a08;
  undefined8 uStack_2a00;
  code *local_29f8;
  undefined8 uStack_29f0;
  code *local_29e8;
  undefined8 uStack_29e0;
  code *local_29d8;
  undefined8 uStack_29d0;
  code *local_29c8;
  undefined8 local_29c0;
  code *local_29b8;
  undefined8 local_29b0;
  FunctionStruct local_29a8;
  code *local_2948;
  undefined8 uStack_2940;
  code *local_2938;
  undefined8 uStack_2930;
  code *local_2928;
  undefined8 uStack_2920;
  code *local_2918;
  undefined8 uStack_2910;
  code *local_2908;
  undefined8 local_2900;
  code *local_28f8;
  undefined8 local_28f0;
  FunctionStruct local_28e8;
  code *local_2888;
  undefined8 uStack_2880;
  code *local_2878;
  undefined8 uStack_2870;
  code *local_2868;
  undefined8 uStack_2860;
  code *local_2858;
  undefined8 uStack_2850;
  code *local_2848;
  undefined8 local_2840;
  code *local_2838;
  undefined8 local_2830;
  FunctionStruct local_2828;
  code *local_27c8;
  undefined8 uStack_27c0;
  code *local_27b8;
  undefined8 uStack_27b0;
  code *local_27a8;
  undefined8 uStack_27a0;
  code *local_2798;
  undefined8 uStack_2790;
  code *local_2788;
  undefined8 local_2780;
  code *local_2778;
  undefined8 local_2770;
  FunctionStruct local_2768;
  code *local_2708;
  undefined8 uStack_2700;
  code *local_26f8;
  undefined8 uStack_26f0;
  code *local_26e8;
  undefined8 uStack_26e0;
  code *local_26d8;
  undefined8 uStack_26d0;
  code *local_26c8;
  undefined8 local_26c0;
  code *local_26b8;
  undefined8 local_26b0;
  FunctionStruct local_26a8;
  code *local_2648;
  undefined8 uStack_2640;
  code *local_2638;
  undefined8 uStack_2630;
  code *local_2628;
  undefined8 uStack_2620;
  code *local_2618;
  undefined8 uStack_2610;
  code *local_2608;
  undefined8 local_2600;
  code *local_25f8;
  undefined8 local_25f0;
  FunctionStruct local_25e8;
  code *local_2588;
  undefined8 uStack_2580;
  code *local_2578;
  undefined8 uStack_2570;
  code *local_2568;
  undefined8 uStack_2560;
  code *local_2558;
  undefined8 uStack_2550;
  code *local_2548;
  undefined8 local_2540;
  code *local_2538;
  undefined8 local_2530;
  FunctionStruct local_2528;
  code *local_24c8;
  undefined8 uStack_24c0;
  code *local_24b8;
  undefined8 uStack_24b0;
  code *local_24a8;
  undefined8 uStack_24a0;
  code *local_2498;
  undefined8 uStack_2490;
  code *local_2488;
  undefined8 local_2480;
  code *local_2478;
  undefined8 local_2470;
  FunctionStruct local_2468;
  code *local_2408;
  undefined8 uStack_2400;
  code *local_23f8;
  undefined8 uStack_23f0;
  code *local_23e8;
  undefined8 uStack_23e0;
  code *local_23d8;
  undefined8 uStack_23d0;
  code *local_23c8;
  undefined8 local_23c0;
  code *local_23b8;
  undefined8 local_23b0;
  FunctionStruct local_23a8;
  code *local_2348;
  undefined8 uStack_2340;
  code *local_2338;
  undefined8 uStack_2330;
  code *local_2328;
  undefined8 uStack_2320;
  code *local_2318;
  undefined8 uStack_2310;
  code *local_2308;
  undefined8 local_2300;
  code *local_22f8;
  undefined8 local_22f0;
  FunctionStruct local_22e8;
  code *local_2288;
  undefined8 uStack_2280;
  code *local_2278;
  undefined8 uStack_2270;
  code *local_2268;
  undefined8 uStack_2260;
  code *local_2258;
  undefined8 uStack_2250;
  code *local_2248;
  undefined8 local_2240;
  code *local_2238;
  undefined8 local_2230;
  FunctionStruct local_2228;
  code *local_21c8;
  undefined8 uStack_21c0;
  code *local_21b8;
  undefined8 uStack_21b0;
  code *local_21a8;
  undefined8 uStack_21a0;
  code *local_2198;
  undefined8 uStack_2190;
  code *local_2188;
  undefined8 local_2180;
  code *local_2178;
  undefined8 local_2170;
  FunctionStruct local_2168;
  code *local_2108;
  undefined8 uStack_2100;
  code *local_20f8;
  undefined8 uStack_20f0;
  code *local_20e8;
  undefined8 uStack_20e0;
  code *local_20d8;
  undefined8 uStack_20d0;
  code *local_20c8;
  undefined8 local_20c0;
  code *local_20b8;
  undefined8 local_20b0;
  FunctionStruct local_20a8;
  code *local_2048;
  undefined8 uStack_2040;
  code *local_2038;
  undefined8 uStack_2030;
  code *local_2028;
  undefined8 uStack_2020;
  code *local_2018;
  undefined8 uStack_2010;
  code *local_2008;
  undefined8 local_2000;
  code *local_1ff8;
  undefined8 local_1ff0;
  FunctionStruct local_1fe8;
  code *local_1f88;
  undefined8 uStack_1f80;
  code *local_1f78;
  undefined8 uStack_1f70;
  code *local_1f68;
  undefined8 uStack_1f60;
  code *local_1f58;
  undefined8 uStack_1f50;
  code *local_1f48;
  undefined8 local_1f40;
  code *local_1f38;
  undefined8 local_1f30;
  FunctionStruct local_1f28;
  code *local_1ec8;
  undefined8 uStack_1ec0;
  code *local_1eb8;
  undefined8 uStack_1eb0;
  code *local_1ea8;
  undefined8 uStack_1ea0;
  code *local_1e98;
  undefined8 uStack_1e90;
  code *local_1e88;
  undefined8 local_1e80;
  code *local_1e78;
  undefined8 local_1e70;
  FunctionStruct local_1e68;
  code *local_1e08;
  undefined8 uStack_1e00;
  code *local_1df8;
  undefined8 uStack_1df0;
  code *local_1de8;
  undefined8 uStack_1de0;
  code *local_1dd8;
  undefined8 uStack_1dd0;
  code *local_1dc8;
  undefined8 local_1dc0;
  code *local_1db8;
  undefined8 local_1db0;
  FunctionStruct local_1da8;
  code *local_1d48;
  undefined8 uStack_1d40;
  code *local_1d38;
  undefined8 uStack_1d30;
  code *local_1d28;
  undefined8 uStack_1d20;
  code *local_1d18;
  undefined8 uStack_1d10;
  code *local_1d08;
  undefined8 local_1d00;
  code *local_1cf8;
  undefined8 local_1cf0;
  FunctionStruct local_1ce8;
  code *local_1c88;
  undefined8 uStack_1c80;
  code *local_1c78;
  undefined8 uStack_1c70;
  code *local_1c68;
  undefined8 uStack_1c60;
  code *local_1c58;
  undefined8 uStack_1c50;
  code *local_1c48;
  undefined8 local_1c40;
  code *local_1c38;
  undefined8 local_1c30;
  FunctionStruct local_1c28;
  code *local_1bc8;
  undefined8 uStack_1bc0;
  code *local_1bb8;
  undefined8 uStack_1bb0;
  code *local_1ba8;
  undefined8 uStack_1ba0;
  code *local_1b98;
  undefined8 uStack_1b90;
  code *local_1b88;
  undefined8 local_1b80;
  code *local_1b78;
  undefined8 local_1b70;
  FunctionStruct local_1b68;
  code *local_1b08;
  undefined8 uStack_1b00;
  code *local_1af8;
  undefined8 uStack_1af0;
  code *local_1ae8;
  undefined8 uStack_1ae0;
  code *local_1ad8;
  undefined8 uStack_1ad0;
  code *local_1ac8;
  undefined8 local_1ac0;
  code *local_1ab8;
  undefined8 local_1ab0;
  FunctionStruct local_1aa8;
  code *local_1a48;
  undefined8 uStack_1a40;
  code *local_1a38;
  undefined8 uStack_1a30;
  code *local_1a28;
  undefined8 uStack_1a20;
  code *local_1a18;
  undefined8 uStack_1a10;
  code *local_1a08;
  undefined8 local_1a00;
  code *local_19f8;
  undefined8 local_19f0;
  FunctionStruct local_19e8;
  code *local_1988;
  undefined8 uStack_1980;
  code *local_1978;
  undefined8 uStack_1970;
  code *local_1968;
  undefined8 uStack_1960;
  code *local_1958;
  undefined8 uStack_1950;
  code *local_1948;
  undefined8 local_1940;
  code *local_1938;
  undefined8 local_1930;
  FunctionStruct local_1928;
  code *local_18c8;
  undefined8 uStack_18c0;
  code *local_18b8;
  undefined8 uStack_18b0;
  code *local_18a8;
  undefined8 uStack_18a0;
  code *local_1898;
  undefined8 uStack_1890;
  code *local_1888;
  undefined8 local_1880;
  code *local_1878;
  undefined8 local_1870;
  FunctionStruct local_1868;
  code *local_1808;
  undefined8 uStack_1800;
  code *local_17f8;
  undefined8 uStack_17f0;
  code *local_17e8;
  undefined8 uStack_17e0;
  code *local_17d8;
  undefined8 uStack_17d0;
  code *local_17c8;
  undefined8 local_17c0;
  code *local_17b8;
  undefined8 local_17b0;
  FunctionStruct local_17a8;
  code *local_1748;
  undefined8 uStack_1740;
  code *local_1738;
  undefined8 uStack_1730;
  code *local_1728;
  undefined8 uStack_1720;
  code *local_1718;
  undefined8 uStack_1710;
  code *local_1708;
  undefined8 local_1700;
  code *local_16f8;
  undefined8 local_16f0;
  FunctionStruct local_16e8;
  code *local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  undefined8 uStack_1670;
  code *local_1668;
  undefined8 uStack_1660;
  code *local_1658;
  undefined8 uStack_1650;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
  *local_1648;
  undefined8 local_1640;
  code *local_1638;
  undefined8 local_1630;
  FunctionStruct local_1628;
  code *local_15c8;
  undefined8 uStack_15c0;
  code *local_15b8;
  undefined8 uStack_15b0;
  code *local_15a8;
  undefined8 uStack_15a0;
  code *local_1598;
  undefined8 uStack_1590;
  code *local_1588;
  undefined8 local_1580;
  code *local_1578;
  undefined8 local_1570;
  FunctionStruct local_1568;
  code *local_1508;
  undefined8 uStack_1500;
  code *local_14f8;
  undefined8 uStack_14f0;
  code *local_14e8;
  undefined8 uStack_14e0;
  code *local_14d8;
  undefined8 uStack_14d0;
  code *local_14c8;
  undefined8 local_14c0;
  code *local_14b8;
  undefined8 local_14b0;
  FunctionStruct local_14a8;
  code *local_1448;
  undefined8 uStack_1440;
  code *local_1438;
  undefined8 uStack_1430;
  code *local_1428;
  undefined8 uStack_1420;
  code *local_1418;
  undefined8 uStack_1410;
  code *local_1408;
  undefined8 local_1400;
  code *local_13f8;
  undefined8 local_13f0;
  FunctionStruct local_13e8;
  code *local_1388;
  undefined8 uStack_1380;
  code *local_1378;
  undefined8 uStack_1370;
  code *local_1368;
  undefined8 uStack_1360;
  code *local_1358;
  undefined8 uStack_1350;
  code *local_1348;
  undefined8 local_1340;
  code *local_1338;
  undefined8 local_1330;
  FunctionStruct local_1328;
  code *local_12c8;
  undefined8 uStack_12c0;
  code *local_12b8;
  undefined8 uStack_12b0;
  code *local_12a8;
  undefined8 uStack_12a0;
  code *local_1298;
  undefined8 uStack_1290;
  code *local_1288;
  undefined8 local_1280;
  code *local_1278;
  undefined8 local_1270;
  FunctionStruct local_1268;
  code *local_1208;
  undefined8 uStack_1200;
  code *local_11f8;
  undefined8 uStack_11f0;
  code *local_11e8;
  undefined8 uStack_11e0;
  code *local_11d8;
  undefined8 uStack_11d0;
  code *local_11c8;
  undefined8 local_11c0;
  code *local_11b8;
  undefined8 local_11b0;
  FunctionStruct local_11a8;
  code *local_1148;
  undefined8 uStack_1140;
  code *local_1138;
  undefined8 uStack_1130;
  code *local_1128;
  undefined8 uStack_1120;
  code *local_1118;
  undefined8 uStack_1110;
  code *local_1108;
  undefined8 local_1100;
  code *local_10f8;
  undefined8 local_10f0;
  FunctionStruct local_10e8;
  code *local_1088;
  undefined8 uStack_1080;
  code *local_1078;
  undefined8 uStack_1070;
  code *local_1068;
  undefined8 uStack_1060;
  code *local_1058;
  undefined8 uStack_1050;
  code *local_1048;
  undefined8 local_1040;
  code *local_1038;
  undefined8 local_1030;
  FunctionStruct local_1028;
  code *local_fc8;
  undefined8 uStack_fc0;
  code *local_fb8;
  undefined8 uStack_fb0;
  code *local_fa8;
  undefined8 uStack_fa0;
  code *local_f98;
  undefined8 uStack_f90;
  code *local_f88;
  undefined8 local_f80;
  code *local_f78;
  undefined8 local_f70;
  FunctionStruct local_f68;
  code *local_f08;
  undefined8 uStack_f00;
  code *local_ef8;
  undefined8 uStack_ef0;
  code *local_ee8;
  undefined8 uStack_ee0;
  code *local_ed8;
  undefined8 uStack_ed0;
  code *local_ec8;
  undefined8 local_ec0;
  code *local_eb8;
  undefined8 local_eb0;
  FunctionStruct local_ea8;
  code *local_e48;
  undefined8 uStack_e40;
  code *local_e38;
  undefined8 uStack_e30;
  code *local_e28;
  undefined8 uStack_e20;
  code *local_e18;
  undefined8 uStack_e10;
  code *local_e08;
  undefined8 local_e00;
  code *local_df8;
  undefined8 local_df0;
  FunctionStruct local_de8;
  code *local_d88;
  undefined8 uStack_d80;
  code *local_d78;
  undefined8 uStack_d70;
  code *local_d68;
  undefined8 uStack_d60;
  code *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  undefined8 local_d40;
  code *local_d38;
  undefined8 local_d30;
  FunctionStruct local_d28;
  code *local_cc8;
  undefined8 uStack_cc0;
  code *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  undefined8 uStack_ca0;
  code *local_c98;
  undefined8 uStack_c90;
  code *local_c88;
  undefined8 local_c80;
  code *local_c78;
  undefined8 local_c70;
  FunctionStruct local_c68;
  code *local_c08;
  undefined8 uStack_c00;
  code *local_bf8;
  undefined8 uStack_bf0;
  code *local_be8;
  undefined8 uStack_be0;
  code *local_bd8;
  undefined8 uStack_bd0;
  code *local_bc8;
  undefined8 local_bc0;
  code *local_bb8;
  undefined8 local_bb0;
  FunctionStruct local_ba8;
  code *local_b48;
  undefined8 uStack_b40;
  code *local_b38;
  undefined8 uStack_b30;
  code *local_b28;
  undefined8 uStack_b20;
  code *local_b18;
  undefined8 uStack_b10;
  code *local_b08;
  undefined8 local_b00;
  code *local_af8;
  undefined8 local_af0;
  FunctionStruct local_ae8;
  code *local_a88;
  undefined8 uStack_a80;
  code *local_a78;
  undefined8 uStack_a70;
  code *local_a68;
  undefined8 uStack_a60;
  code *local_a58;
  undefined8 uStack_a50;
  code *local_a48;
  undefined8 local_a40;
  code *local_a38;
  undefined8 local_a30;
  FunctionStruct local_a28;
  code *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  undefined8 uStack_9b0;
  code *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  undefined8 local_980;
  code *local_978;
  undefined8 local_970;
  FunctionStruct local_968;
  code *local_908;
  undefined8 uStack_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  undefined8 uStack_8e0;
  code *local_8d8;
  undefined8 uStack_8d0;
  code *local_8c8;
  undefined8 local_8c0;
  code *local_8b8;
  undefined8 local_8b0;
  FunctionStruct local_8a8;
  code *local_848;
  undefined8 uStack_840;
  code *local_838;
  undefined8 uStack_830;
  code *local_828;
  undefined8 uStack_820;
  code *local_818;
  undefined8 uStack_810;
  code *local_808;
  undefined8 local_800;
  code *local_7f8;
  undefined8 local_7f0;
  FunctionStruct local_7e8;
  code *local_788;
  undefined8 uStack_780;
  code *local_778;
  undefined8 uStack_770;
  code *local_768;
  undefined8 uStack_760;
  code *local_758;
  undefined8 uStack_750;
  code *local_748;
  undefined8 local_740;
  code *local_738;
  undefined8 local_730;
  FunctionStruct local_728;
  code *local_6c8;
  undefined8 uStack_6c0;
  code *local_6b8;
  undefined8 uStack_6b0;
  code *local_6a8;
  undefined8 uStack_6a0;
  code *local_698;
  undefined8 uStack_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  undefined8 local_670;
  FunctionStruct local_668;
  code *local_608;
  undefined8 uStack_600;
  code *local_5f8;
  undefined8 uStack_5f0;
  code *local_5e8;
  undefined8 uStack_5e0;
  code *local_5d8;
  undefined8 uStack_5d0;
  code *local_5c8;
  undefined8 local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  FunctionStruct local_5a8;
  code *local_548;
  undefined8 uStack_540;
  code *local_538;
  undefined8 uStack_530;
  code *local_528;
  undefined8 uStack_520;
  code *local_518;
  undefined8 uStack_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  undefined8 local_4f0;
  FunctionStruct local_4e8;
  code *local_488;
  undefined8 uStack_480;
  code *local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  code *local_458;
  undefined8 uStack_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  undefined8 local_430;
  FunctionStruct local_428;
  code *local_3c8;
  undefined8 uStack_3c0;
  code *local_3b8;
  undefined8 uStack_3b0;
  code *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  undefined8 uStack_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  undefined8 local_370;
  FunctionStruct local_368;
  code *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  FunctionStruct local_2a8;
  code *local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined8 uStack_220;
  code *local_218;
  undefined8 uStack_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  FunctionStruct local_1e8;
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  FunctionStruct local_128;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  FunctionStruct local_68;
  
  if (createFunctionMap__library_nodes__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_nodes__allChildren()::functionMap);
    if (iVar1 != 0) {
      std::
      map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
      ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             *)0x98138e);
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_nodes__allChildren::functionMap,&__dso_handle)
      ;
      __cxa_guard_release(&createFunctionMap__library_nodes__allChildren()::functionMap);
    }
  }
  if ((createFunctionMap__library_nodes__allChildren::mapFilled & 1U) == 0) {
    local_78 = ColladaParserAutoGen15Private::_begin__COLLADA;
    local_70 = 0;
    local_88 = ColladaParserAutoGen15Private::_data__COLLADA;
    local_80 = 0;
    local_98 = ColladaParserAutoGen15Private::_end__COLLADA;
    uStack_90 = 0;
    local_a8 = ColladaParserAutoGen15Private::_preBegin__COLLADA;
    uStack_a0 = 0;
    local_b8 = ColladaParserAutoGen15Private::_preEnd__COLLADA;
    uStack_b0 = 0;
    local_c8 = ColladaParserAutoGen15Private::_freeAttributes__COLLADA;
    uStack_c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_68,0x9a9d70,0,0x9b9df0,0,in_R9,0x9a9da0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_68._88_8_;
    pmVar2->validateEndFunction = local_68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_68._72_8_;
    pmVar2->validateBeginFunction = local_68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_68._56_8_;
    pmVar2->endFunction = local_68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_68._40_8_;
    pmVar2->textDataFunction = local_68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_68._24_8_;
    pmVar2->beginFunction = local_68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_68._8_8_;
    local_138 = ColladaParserAutoGen15Private::_begin__library_nodes;
    local_130 = 0;
    local_148 = ColladaParserAutoGen15Private::_data__library_nodes;
    local_140 = 0;
    local_158 = ColladaParserAutoGen15Private::_end__library_nodes;
    uStack_150 = 0;
    local_168 = ColladaParserAutoGen15Private::_preBegin__library_nodes;
    uStack_160 = 0;
    local_178 = ColladaParserAutoGen15Private::_preEnd__library_nodes;
    uStack_170 = 0;
    local_188 = ColladaParserAutoGen15Private::_freeAttributes__library_nodes;
    uStack_180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_128,0x9aa540,0,0xa01bb0,0,in_R9,0x9aa570);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_128._88_8_;
    pmVar2->validateEndFunction = local_128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_128._72_8_;
    pmVar2->validateBeginFunction = local_128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_128._56_8_;
    pmVar2->endFunction = local_128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_128._40_8_;
    pmVar2->textDataFunction = local_128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_128._24_8_;
    pmVar2->beginFunction = local_128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_128._8_8_;
    local_1f8 = ColladaParserAutoGen15Private::_begin__asset;
    local_1f0 = 0;
    local_208 = ColladaParserAutoGen15Private::_data__asset;
    local_200 = 0;
    local_218 = ColladaParserAutoGen15Private::_end__asset;
    uStack_210 = 0;
    local_228 = ColladaParserAutoGen15Private::_preBegin__asset;
    uStack_220 = 0;
    local_238 = ColladaParserAutoGen15Private::_preEnd__asset;
    uStack_230 = 0;
    local_248 = ColladaParserAutoGen15Private::_freeAttributes__asset;
    uStack_240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1e8,0x9a9ff0,0,0x9ba3d0,0,in_R9,0x9aa020);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_1e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e8._88_8_;
    pmVar2->validateEndFunction = local_1e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e8._72_8_;
    pmVar2->validateBeginFunction = local_1e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e8._56_8_;
    pmVar2->endFunction = local_1e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e8._40_8_;
    pmVar2->textDataFunction = local_1e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e8._24_8_;
    pmVar2->beginFunction = local_1e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e8._8_8_;
    local_2b8 = ColladaParserAutoGen15Private::_begin__extra;
    local_2b0 = 0;
    local_2c8 = ColladaParserAutoGen15Private::_data__extra;
    local_2c0 = 0;
    local_2d8 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2d0 = 0;
    local_2e8 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_2e0 = 0;
    local_2f8 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_2f0 = 0;
    local_308 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_300 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2a8,0x9aa040,0,0x9bc100,0,in_R9,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_2a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a8._88_8_;
    pmVar2->validateEndFunction = local_2a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a8._72_8_;
    pmVar2->validateBeginFunction = local_2a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a8._56_8_;
    pmVar2->endFunction = local_2a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a8._40_8_;
    pmVar2->textDataFunction = local_2a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a8._24_8_;
    pmVar2->beginFunction = local_2a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a8._8_8_;
    local_378 = ColladaParserAutoGen15Private::_begin__node;
    local_370 = 0;
    local_388 = ColladaParserAutoGen15Private::_data__node;
    local_380 = 0;
    local_398 = ColladaParserAutoGen15Private::_end__node;
    uStack_390 = 0;
    local_3a8 = ColladaParserAutoGen15Private::_preBegin__node;
    uStack_3a0 = 0;
    local_3b8 = ColladaParserAutoGen15Private::_preEnd__node;
    uStack_3b0 = 0;
    local_3c8 = ColladaParserAutoGen15Private::_freeAttributes__node;
    uStack_3c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_368,0x9ac070,0,0xa01d40,0,in_R9,0x9ac0a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_368.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_368._88_8_;
    pmVar2->validateEndFunction = local_368.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_368._72_8_;
    pmVar2->validateBeginFunction = local_368.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_368._56_8_;
    pmVar2->endFunction = local_368.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_368._40_8_;
    pmVar2->textDataFunction = local_368.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_368._24_8_;
    pmVar2->beginFunction = local_368.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_368._8_8_;
    local_438 = ColladaParserAutoGen15Private::_begin__contributor;
    local_430 = 0;
    local_448 = ColladaParserAutoGen15Private::_data__contributor;
    local_440 = 0;
    local_458 = ColladaParserAutoGen15Private::_end__contributor;
    uStack_450 = 0;
    local_468 = ColladaParserAutoGen15Private::_preBegin__contributor;
    uStack_460 = 0;
    local_478 = ColladaParserAutoGen15Private::_preEnd__contributor;
    uStack_470 = 0;
    local_488 = ColladaParserAutoGen15Private::_freeAttributes__contributor;
    uStack_480 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_428,0x9ad7e0,0,0x9ba430,0,in_R9,0x9ad810);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_428.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_428._88_8_;
    pmVar2->validateEndFunction = local_428.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_428._72_8_;
    pmVar2->validateBeginFunction = local_428.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_428._56_8_;
    pmVar2->endFunction = local_428.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_428._40_8_;
    pmVar2->textDataFunction = local_428.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_428._24_8_;
    pmVar2->beginFunction = local_428.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_428._8_8_;
    local_4f8 = ColladaParserAutoGen15Private::_begin__coverage;
    local_4f0 = 0;
    local_508 = ColladaParserAutoGen15Private::_data__coverage;
    local_500 = 0;
    local_518 = ColladaParserAutoGen15Private::_end__coverage;
    uStack_510 = 0;
    local_528 = ColladaParserAutoGen15Private::_preBegin__coverage;
    uStack_520 = 0;
    local_538 = ColladaParserAutoGen15Private::_preEnd__coverage;
    uStack_530 = 0;
    local_548 = ColladaParserAutoGen15Private::_freeAttributes__coverage;
    uStack_540 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_4e8,0x9ad830,0,0x9bae10,0,in_R9,0x9ad860);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_4e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4e8._88_8_;
    pmVar2->validateEndFunction = local_4e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4e8._72_8_;
    pmVar2->validateBeginFunction = local_4e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4e8._56_8_;
    pmVar2->endFunction = local_4e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4e8._40_8_;
    pmVar2->textDataFunction = local_4e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4e8._24_8_;
    pmVar2->beginFunction = local_4e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4e8._8_8_;
    local_5b8 = ColladaParserAutoGen15Private::_begin__created;
    local_5b0 = 0;
    local_5c8 = ColladaParserAutoGen15Private::_data__created;
    local_5c0 = 0;
    local_5d8 = ColladaParserAutoGen15Private::_end__created;
    uStack_5d0 = 0;
    local_5e8 = ColladaParserAutoGen15Private::_preBegin__created;
    uStack_5e0 = 0;
    local_5f8 = ColladaParserAutoGen15Private::_preEnd__created;
    uStack_5f0 = 0;
    local_608 = ColladaParserAutoGen15Private::_freeAttributes__created;
    uStack_600 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_5a8,0x9ad880,0,0x9bb850,0,in_R9,0x9ad8b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_5a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_5a8._88_8_;
    pmVar2->validateEndFunction = local_5a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_5a8._72_8_;
    pmVar2->validateBeginFunction = local_5a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_5a8._56_8_;
    pmVar2->endFunction = local_5a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_5a8._40_8_;
    pmVar2->textDataFunction = local_5a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_5a8._24_8_;
    pmVar2->beginFunction = local_5a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_5a8._8_8_;
    local_678 = ColladaParserAutoGen15Private::_begin__extra;
    local_670 = 0;
    local_688 = ColladaParserAutoGen15Private::_data__extra;
    local_680 = 0;
    local_698 = ColladaParserAutoGen15Private::_end__extra;
    uStack_690 = 0;
    local_6a8 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_6a0 = 0;
    local_6b8 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_6b0 = 0;
    local_6c8 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_6c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_668,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
    pmVar2->freeAttributesFunction = local_668.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_668._88_8_;
    pmVar2->validateEndFunction = local_668.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_668._72_8_;
    pmVar2->validateBeginFunction = local_668.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_668._56_8_;
    pmVar2->endFunction = local_668.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_668._40_8_;
    pmVar2->textDataFunction = local_668.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_668._24_8_;
    pmVar2->beginFunction = local_668.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_668._8_8_;
    __k = ColladaParserAutoGen15Private::_begin__keywords;
    local_738 = ColladaParserAutoGen15Private::_begin__keywords;
    local_730 = 0;
    this = ColladaParserAutoGen15Private::_data__keywords;
    local_748 = ColladaParserAutoGen15Private::_data__keywords;
    local_740 = 0;
    local_758 = ColladaParserAutoGen15Private::_end__keywords;
    uStack_750 = 0;
    local_768 = ColladaParserAutoGen15Private::_preBegin__keywords;
    uStack_760 = 0;
    local_778 = ColladaParserAutoGen15Private::_preEnd__keywords;
    uStack_770 = 0;
    local_788 = ColladaParserAutoGen15Private::_freeAttributes__keywords;
    uStack_780 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_728,0x9ad8d0,0,0x9bb8d0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ad900);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_728.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_728._88_8_;
    pmVar2->validateEndFunction = local_728.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_728._72_8_;
    pmVar2->validateBeginFunction = local_728.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_728._56_8_;
    pmVar2->endFunction = local_728.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_728._40_8_;
    pmVar2->textDataFunction = local_728.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_728._24_8_;
    pmVar2->beginFunction = local_728.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_728._8_8_;
    local_7f8 = ColladaParserAutoGen15Private::_begin__modified;
    local_7f0 = 0;
    local_808 = ColladaParserAutoGen15Private::_data__modified;
    local_800 = 0;
    local_818 = ColladaParserAutoGen15Private::_end__modified;
    uStack_810 = 0;
    local_828 = ColladaParserAutoGen15Private::_preBegin__modified;
    uStack_820 = 0;
    local_838 = ColladaParserAutoGen15Private::_preEnd__modified;
    uStack_830 = 0;
    local_848 = ColladaParserAutoGen15Private::_freeAttributes__modified;
    uStack_840 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_7e8,0x9ad920,0,0x9bb950,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ad950);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_7e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_7e8._88_8_;
    pmVar2->validateEndFunction = local_7e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_7e8._72_8_;
    pmVar2->validateBeginFunction = local_7e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_7e8._56_8_;
    pmVar2->endFunction = local_7e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_7e8._40_8_;
    pmVar2->textDataFunction = local_7e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_7e8._24_8_;
    pmVar2->beginFunction = local_7e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_7e8._8_8_;
    local_8b8 = ColladaParserAutoGen15Private::_begin__revision;
    local_8b0 = 0;
    local_8c8 = ColladaParserAutoGen15Private::_data__revision;
    local_8c0 = 0;
    local_8d8 = ColladaParserAutoGen15Private::_end__revision;
    uStack_8d0 = 0;
    local_8e8 = ColladaParserAutoGen15Private::_preBegin__revision;
    uStack_8e0 = 0;
    local_8f8 = ColladaParserAutoGen15Private::_preEnd__revision;
    uStack_8f0 = 0;
    local_908 = ColladaParserAutoGen15Private::_freeAttributes__revision;
    uStack_900 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_8a8,0x9ad970,0,0x9bb9d0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ad9a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_8a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_8a8._88_8_;
    pmVar2->validateEndFunction = local_8a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_8a8._72_8_;
    pmVar2->validateBeginFunction = local_8a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_8a8._56_8_;
    pmVar2->endFunction = local_8a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_8a8._40_8_;
    pmVar2->textDataFunction = local_8a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_8a8._24_8_;
    pmVar2->beginFunction = local_8a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_8a8._8_8_;
    local_978 = ColladaParserAutoGen15Private::_begin__subject;
    local_970 = 0;
    local_988 = ColladaParserAutoGen15Private::_data__subject;
    local_980 = 0;
    local_998 = ColladaParserAutoGen15Private::_end__subject;
    uStack_990 = 0;
    local_9a8 = ColladaParserAutoGen15Private::_preBegin__subject;
    uStack_9a0 = 0;
    local_9b8 = ColladaParserAutoGen15Private::_preEnd__subject;
    uStack_9b0 = 0;
    local_9c8 = ColladaParserAutoGen15Private::_freeAttributes__subject;
    uStack_9c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_968,0x9ad9c0,0,0x9bba50,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ad9f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_968.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_968._88_8_;
    pmVar2->validateEndFunction = local_968.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_968._72_8_;
    pmVar2->validateBeginFunction = local_968.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_968._56_8_;
    pmVar2->endFunction = local_968.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_968._40_8_;
    pmVar2->textDataFunction = local_968.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_968._24_8_;
    pmVar2->beginFunction = local_968.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_968._8_8_;
    local_a38 = ColladaParserAutoGen15Private::_begin__title;
    local_a30 = 0;
    local_a48 = ColladaParserAutoGen15Private::_data__title;
    local_a40 = 0;
    local_a58 = ColladaParserAutoGen15Private::_end__title;
    uStack_a50 = 0;
    local_a68 = ColladaParserAutoGen15Private::_preBegin__title;
    uStack_a60 = 0;
    local_a78 = ColladaParserAutoGen15Private::_preEnd__title;
    uStack_a70 = 0;
    local_a88 = ColladaParserAutoGen15Private::_freeAttributes__title;
    uStack_a80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_a28,0x9ada10,0,0x9bbad0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ada40);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_a28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_a28._88_8_;
    pmVar2->validateEndFunction = local_a28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_a28._72_8_;
    pmVar2->validateBeginFunction = local_a28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_a28._56_8_;
    pmVar2->endFunction = local_a28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_a28._40_8_;
    pmVar2->textDataFunction = local_a28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_a28._24_8_;
    pmVar2->beginFunction = local_a28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_a28._8_8_;
    local_af8 = ColladaParserAutoGen15Private::_begin__unit;
    local_af0 = 0;
    local_b08 = ColladaParserAutoGen15Private::_data__unit;
    local_b00 = 0;
    local_b18 = ColladaParserAutoGen15Private::_end__unit;
    uStack_b10 = 0;
    local_b28 = ColladaParserAutoGen15Private::_preBegin__unit;
    uStack_b20 = 0;
    local_b38 = ColladaParserAutoGen15Private::_preEnd__unit;
    uStack_b30 = 0;
    local_b48 = ColladaParserAutoGen15Private::_freeAttributes__unit;
    uStack_b40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_ae8,0x9ada60,0,0x9bbb50,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ada90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_ae8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ae8._88_8_;
    pmVar2->validateEndFunction = local_ae8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ae8._72_8_;
    pmVar2->validateBeginFunction = local_ae8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ae8._56_8_;
    pmVar2->endFunction = local_ae8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ae8._40_8_;
    pmVar2->textDataFunction = local_ae8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ae8._24_8_;
    pmVar2->beginFunction = local_ae8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ae8._8_8_;
    local_bb8 = ColladaParserAutoGen15Private::_begin__up_axis;
    local_bb0 = 0;
    local_bc8 = ColladaParserAutoGen15Private::_data__up_axis;
    local_bc0 = 0;
    local_bd8 = ColladaParserAutoGen15Private::_end__up_axis;
    uStack_bd0 = 0;
    local_be8 = ColladaParserAutoGen15Private::_preBegin__up_axis;
    uStack_be0 = 0;
    local_bf8 = ColladaParserAutoGen15Private::_preEnd__up_axis;
    uStack_bf0 = 0;
    local_c08 = ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    uStack_c00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_ba8,0x9adab0,0,0x9bbd20,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adae0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_ba8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ba8._88_8_;
    pmVar2->validateEndFunction = local_ba8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ba8._72_8_;
    pmVar2->validateBeginFunction = local_ba8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ba8._56_8_;
    pmVar2->endFunction = local_ba8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ba8._40_8_;
    pmVar2->textDataFunction = local_ba8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ba8._24_8_;
    pmVar2->beginFunction = local_ba8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ba8._8_8_;
    local_c78 = ColladaParserAutoGen15Private::_begin__author;
    local_c70 = 0;
    local_c88 = ColladaParserAutoGen15Private::_data__author;
    local_c80 = 0;
    local_c98 = ColladaParserAutoGen15Private::_end__author;
    uStack_c90 = 0;
    local_ca8 = ColladaParserAutoGen15Private::_preBegin__author;
    uStack_ca0 = 0;
    local_cb8 = ColladaParserAutoGen15Private::_preEnd__author;
    uStack_cb0 = 0;
    local_cc8 = ColladaParserAutoGen15Private::_freeAttributes__author;
    uStack_cc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_c68,0x9adb00,0,0x9ba490,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adb30);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_c68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_c68._88_8_;
    pmVar2->validateEndFunction = local_c68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_c68._72_8_;
    pmVar2->validateBeginFunction = local_c68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_c68._56_8_;
    pmVar2->endFunction = local_c68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_c68._40_8_;
    pmVar2->textDataFunction = local_c68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_c68._24_8_;
    pmVar2->beginFunction = local_c68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_c68._8_8_;
    local_d38 = ColladaParserAutoGen15Private::_begin__author_email;
    local_d30 = 0;
    local_d48 = ColladaParserAutoGen15Private::_data__author_email;
    local_d40 = 0;
    local_d58 = ColladaParserAutoGen15Private::_end__author_email;
    uStack_d50 = 0;
    local_d68 = ColladaParserAutoGen15Private::_preBegin__author_email;
    uStack_d60 = 0;
    local_d78 = ColladaParserAutoGen15Private::_preEnd__author_email;
    uStack_d70 = 0;
    local_d88 = ColladaParserAutoGen15Private::_freeAttributes__author_email;
    uStack_d80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_d28,0x9adb50,0,0x9ba510,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adb80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_d28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_d28._88_8_;
    pmVar2->validateEndFunction = local_d28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_d28._72_8_;
    pmVar2->validateBeginFunction = local_d28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_d28._56_8_;
    pmVar2->endFunction = local_d28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_d28._40_8_;
    pmVar2->textDataFunction = local_d28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_d28._24_8_;
    pmVar2->beginFunction = local_d28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_d28._8_8_;
    local_df8 = ColladaParserAutoGen15Private::_begin__author_website;
    local_df0 = 0;
    local_e08 = ColladaParserAutoGen15Private::_data__author_website;
    local_e00 = 0;
    local_e18 = ColladaParserAutoGen15Private::_end__author_website;
    uStack_e10 = 0;
    local_e28 = ColladaParserAutoGen15Private::_preBegin__author_website;
    uStack_e20 = 0;
    local_e38 = ColladaParserAutoGen15Private::_preEnd__author_website;
    uStack_e30 = 0;
    local_e48 = ColladaParserAutoGen15Private::_freeAttributes__author_website;
    uStack_e40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_de8,0x9adba0,0,0x9ba6d0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adbd0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_de8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_de8._88_8_;
    pmVar2->validateEndFunction = local_de8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_de8._72_8_;
    pmVar2->validateBeginFunction = local_de8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_de8._56_8_;
    pmVar2->endFunction = local_de8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_de8._40_8_;
    pmVar2->textDataFunction = local_de8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_de8._24_8_;
    pmVar2->beginFunction = local_de8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_de8._8_8_;
    local_eb8 = ColladaParserAutoGen15Private::_begin__authoring_tool;
    local_eb0 = 0;
    local_ec8 = ColladaParserAutoGen15Private::_data__authoring_tool;
    local_ec0 = 0;
    local_ed8 = ColladaParserAutoGen15Private::_end__authoring_tool;
    uStack_ed0 = 0;
    local_ee8 = ColladaParserAutoGen15Private::_preBegin__authoring_tool;
    uStack_ee0 = 0;
    local_ef8 = ColladaParserAutoGen15Private::_preEnd__authoring_tool;
    uStack_ef0 = 0;
    local_f08 = ColladaParserAutoGen15Private::_freeAttributes__authoring_tool;
    uStack_f00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_ea8,0x9adbf0,0,0x9ba9b0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adc20);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_ea8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ea8._88_8_;
    pmVar2->validateEndFunction = local_ea8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ea8._72_8_;
    pmVar2->validateBeginFunction = local_ea8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ea8._56_8_;
    pmVar2->endFunction = local_ea8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ea8._40_8_;
    pmVar2->textDataFunction = local_ea8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ea8._24_8_;
    pmVar2->beginFunction = local_ea8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ea8._8_8_;
    local_f78 = ColladaParserAutoGen15Private::_begin__comments;
    local_f70 = 0;
    local_f88 = ColladaParserAutoGen15Private::_data__comments;
    local_f80 = 0;
    local_f98 = ColladaParserAutoGen15Private::_end__comments;
    uStack_f90 = 0;
    local_fa8 = ColladaParserAutoGen15Private::_preBegin__comments;
    uStack_fa0 = 0;
    local_fb8 = ColladaParserAutoGen15Private::_preEnd__comments;
    uStack_fb0 = 0;
    local_fc8 = ColladaParserAutoGen15Private::_freeAttributes__comments;
    uStack_fc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_f68,0x9adc40,0,0x9baa30,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adc70);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_f68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_f68._88_8_;
    pmVar2->validateEndFunction = local_f68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_f68._72_8_;
    pmVar2->validateBeginFunction = local_f68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_f68._56_8_;
    pmVar2->endFunction = local_f68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_f68._40_8_;
    pmVar2->textDataFunction = local_f68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_f68._24_8_;
    pmVar2->beginFunction = local_f68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_f68._8_8_;
    local_1038 = ColladaParserAutoGen15Private::_begin__copyright;
    local_1030 = 0;
    local_1048 = ColladaParserAutoGen15Private::_data__copyright;
    local_1040 = 0;
    local_1058 = ColladaParserAutoGen15Private::_end__copyright;
    uStack_1050 = 0;
    local_1068 = ColladaParserAutoGen15Private::_preBegin__copyright;
    uStack_1060 = 0;
    local_1078 = ColladaParserAutoGen15Private::_preEnd__copyright;
    uStack_1070 = 0;
    local_1088 = ColladaParserAutoGen15Private::_freeAttributes__copyright;
    uStack_1080 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1028,0x9adc90,0,0x9baab0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adcc0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1028.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1028._88_8_;
    pmVar2->validateEndFunction = local_1028.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1028._72_8_;
    pmVar2->validateBeginFunction = local_1028.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1028._56_8_;
    pmVar2->endFunction = local_1028.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1028._40_8_;
    pmVar2->textDataFunction = local_1028.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1028._24_8_;
    pmVar2->beginFunction = local_1028.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1028._8_8_;
    local_10f8 = ColladaParserAutoGen15Private::_begin__source_data;
    local_10f0 = 0;
    local_1108 = ColladaParserAutoGen15Private::_data__source_data;
    local_1100 = 0;
    local_1118 = ColladaParserAutoGen15Private::_end__source_data;
    uStack_1110 = 0;
    local_1128 = ColladaParserAutoGen15Private::_preBegin__source_data;
    uStack_1120 = 0;
    local_1138 = ColladaParserAutoGen15Private::_preEnd__source_data;
    uStack_1130 = 0;
    local_1148 = ColladaParserAutoGen15Private::_freeAttributes__source_data;
    uStack_1140 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_10e8,0x9adce0,0,0x9bab30,0,(ElementValidateEndFunctionPtr)pcVar3,0x9add10);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_10e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_10e8._88_8_;
    pmVar2->validateEndFunction = local_10e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_10e8._72_8_;
    pmVar2->validateBeginFunction = local_10e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_10e8._56_8_;
    pmVar2->endFunction = local_10e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_10e8._40_8_;
    pmVar2->textDataFunction = local_10e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_10e8._24_8_;
    pmVar2->beginFunction = local_10e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_10e8._8_8_;
    local_11b8 = ColladaParserAutoGen15Private::_begin__geographic_location;
    local_11b0 = 0;
    local_11c8 = ColladaParserAutoGen15Private::_data__geographic_location;
    local_11c0 = 0;
    local_11d8 = ColladaParserAutoGen15Private::_end__geographic_location;
    uStack_11d0 = 0;
    local_11e8 = ColladaParserAutoGen15Private::_preBegin__geographic_location;
    uStack_11e0 = 0;
    local_11f8 = ColladaParserAutoGen15Private::_preEnd__geographic_location;
    uStack_11f0 = 0;
    local_1208 = ColladaParserAutoGen15Private::_freeAttributes__geographic_location;
    uStack_1200 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_11a8,0x9add30,0,0x9bae70,0,(ElementValidateEndFunctionPtr)pcVar3,0x9add60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_11a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_11a8._88_8_;
    pmVar2->validateEndFunction = local_11a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_11a8._72_8_;
    pmVar2->validateBeginFunction = local_11a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_11a8._56_8_;
    pmVar2->endFunction = local_11a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_11a8._40_8_;
    pmVar2->textDataFunction = local_11a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_11a8._24_8_;
    pmVar2->beginFunction = local_11a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_11a8._8_8_;
    local_1278 = ColladaParserAutoGen15Private::_begin__altitude;
    local_1270 = 0;
    local_1288 = ColladaParserAutoGen15Private::_data__altitude;
    local_1280 = 0;
    local_1298 = ColladaParserAutoGen15Private::_end__altitude;
    uStack_1290 = 0;
    local_12a8 = ColladaParserAutoGen15Private::_preBegin__altitude;
    uStack_12a0 = 0;
    local_12b8 = ColladaParserAutoGen15Private::_preEnd__altitude;
    uStack_12b0 = 0;
    local_12c8 = ColladaParserAutoGen15Private::_freeAttributes__altitude;
    uStack_12c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1268,0x9add80,0,0x9bb310,0,(ElementValidateEndFunctionPtr)pcVar3,0x9addb0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1268.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1268._88_8_;
    pmVar2->validateEndFunction = local_1268.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1268._72_8_;
    pmVar2->validateBeginFunction = local_1268.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1268._56_8_;
    pmVar2->endFunction = local_1268.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1268._40_8_;
    pmVar2->textDataFunction = local_1268.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1268._24_8_;
    pmVar2->beginFunction = local_1268.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1268._8_8_;
    local_1338 = ColladaParserAutoGen15Private::_begin__latitude;
    local_1330 = 0;
    local_1348 = ColladaParserAutoGen15Private::_data__latitude;
    local_1340 = 0;
    local_1358 = ColladaParserAutoGen15Private::_end__latitude;
    uStack_1350 = 0;
    local_1368 = ColladaParserAutoGen15Private::_preBegin__latitude;
    uStack_1360 = 0;
    local_1378 = ColladaParserAutoGen15Private::_preEnd__latitude;
    uStack_1370 = 0;
    local_1388 = ColladaParserAutoGen15Private::_freeAttributes__latitude;
    uStack_1380 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1328,0x9addd0,0,0x9bb0f0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ade00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1328.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1328._88_8_;
    pmVar2->validateEndFunction = local_1328.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1328._72_8_;
    pmVar2->validateBeginFunction = local_1328.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1328._56_8_;
    pmVar2->endFunction = local_1328.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1328._40_8_;
    pmVar2->textDataFunction = local_1328.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1328._24_8_;
    pmVar2->beginFunction = local_1328.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1328._8_8_;
    local_13f8 = ColladaParserAutoGen15Private::_begin__longitude;
    local_13f0 = 0;
    local_1408 = ColladaParserAutoGen15Private::_data__longitude;
    local_1400 = 0;
    local_1418 = ColladaParserAutoGen15Private::_end__longitude;
    uStack_1410 = 0;
    local_1428 = ColladaParserAutoGen15Private::_preBegin__longitude;
    uStack_1420 = 0;
    local_1438 = ColladaParserAutoGen15Private::_preEnd__longitude;
    uStack_1430 = 0;
    local_1448 = ColladaParserAutoGen15Private::_freeAttributes__longitude;
    uStack_1440 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_13e8,0x9ade20,0,0x9baed0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ade50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__asset;
    pmVar2->freeAttributesFunction = local_13e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_13e8._88_8_;
    pmVar2->validateEndFunction = local_13e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_13e8._72_8_;
    pmVar2->validateBeginFunction = local_13e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_13e8._56_8_;
    pmVar2->endFunction = local_13e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_13e8._40_8_;
    pmVar2->textDataFunction = local_13e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_13e8._24_8_;
    pmVar2->beginFunction = local_13e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_13e8._8_8_;
    local_14b8 = ColladaParserAutoGen15Private::_begin__asset;
    local_14b0 = 0;
    local_14c8 = ColladaParserAutoGen15Private::_data__asset;
    local_14c0 = 0;
    local_14d8 = ColladaParserAutoGen15Private::_end__asset;
    uStack_14d0 = 0;
    local_14e8 = ColladaParserAutoGen15Private::_preBegin__asset;
    uStack_14e0 = 0;
    local_14f8 = ColladaParserAutoGen15Private::_preEnd__asset;
    uStack_14f0 = 0;
    local_1508 = ColladaParserAutoGen15Private::_freeAttributes__asset;
    uStack_1500 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_14a8,0x9a9ff0,0,0x9ba3d0,0,0x9ba3f0,0x9aa020);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_14a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_14a8._88_8_;
    pmVar2->validateEndFunction = local_14a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_14a8._72_8_;
    pmVar2->validateBeginFunction = local_14a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_14a8._56_8_;
    pmVar2->endFunction = local_14a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_14a8._40_8_;
    pmVar2->textDataFunction = local_14a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_14a8._24_8_;
    pmVar2->beginFunction = local_14a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_14a8._8_8_;
    local_1578 = ColladaParserAutoGen15Private::_begin__technique____technique_type;
    local_1570 = 0;
    local_1588 = ColladaParserAutoGen15Private::_data__technique____technique_type;
    local_1580 = 0;
    local_1598 = ColladaParserAutoGen15Private::_end__technique____technique_type;
    uStack_1590 = 0;
    local_15a8 = ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    uStack_15a0 = 0;
    local_15b8 = ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    uStack_15b0 = 0;
    local_15c8 = ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    uStack_15c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1568,0x9ade70,0,0x9bc2b0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9adea0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1568.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1568._88_8_;
    pmVar2->validateEndFunction = local_1568.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1568._72_8_;
    pmVar2->validateBeginFunction = local_1568.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1568._56_8_;
    pmVar2->endFunction = local_1568.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1568._40_8_;
    pmVar2->textDataFunction = local_1568.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1568._24_8_;
    pmVar2->beginFunction = local_1568.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1568._8_8_;
    local_1630 = 0;
    local_1640 = 0;
    local_1658 = ColladaParserAutoGen15Private::_end__keywords;
    uStack_1650 = 0;
    local_1668 = ColladaParserAutoGen15Private::_preBegin__keywords;
    uStack_1660 = 0;
    local_1678 = ColladaParserAutoGen15Private::_preEnd__keywords;
    uStack_1670 = 0;
    local_1688 = ColladaParserAutoGen15Private::_freeAttributes__keywords;
    uStack_1680 = 0;
    local_1648 = (map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                  *)this;
    local_1638 = __k;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1628,(ElementBeginFunctionPtr)__k,0,(ElementEndFunctionPtr)this,0,0x9bb910,
               0x9ad900);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1628.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1628._88_8_;
    pmVar2->validateEndFunction = local_1628.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1628._72_8_;
    pmVar2->validateBeginFunction = local_1628.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1628._56_8_;
    pmVar2->endFunction = local_1628.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1628._40_8_;
    pmVar2->textDataFunction = local_1628.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1628._24_8_;
    pmVar2->beginFunction = local_1628.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1628._8_8_;
    local_16f8 = ColladaParserAutoGen15Private::_begin__modified;
    local_16f0 = 0;
    local_1708 = ColladaParserAutoGen15Private::_data__modified;
    local_1700 = 0;
    local_1718 = ColladaParserAutoGen15Private::_end__modified;
    uStack_1710 = 0;
    local_1728 = ColladaParserAutoGen15Private::_preBegin__modified;
    uStack_1720 = 0;
    local_1738 = ColladaParserAutoGen15Private::_preEnd__modified;
    uStack_1730 = 0;
    local_1748 = ColladaParserAutoGen15Private::_freeAttributes__modified;
    uStack_1740 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_16e8,0x9ad920,0,0x9bb950,0,0x9bb990,0x9ad950);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_16e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_16e8._88_8_;
    pmVar2->validateEndFunction = local_16e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_16e8._72_8_;
    pmVar2->validateBeginFunction = local_16e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_16e8._56_8_;
    pmVar2->endFunction = local_16e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_16e8._40_8_;
    pmVar2->textDataFunction = local_16e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_16e8._24_8_;
    pmVar2->beginFunction = local_16e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_16e8._8_8_;
    local_17b8 = ColladaParserAutoGen15Private::_begin__revision;
    local_17b0 = 0;
    local_17c8 = ColladaParserAutoGen15Private::_data__revision;
    local_17c0 = 0;
    local_17d8 = ColladaParserAutoGen15Private::_end__revision;
    uStack_17d0 = 0;
    local_17e8 = ColladaParserAutoGen15Private::_preBegin__revision;
    uStack_17e0 = 0;
    local_17f8 = ColladaParserAutoGen15Private::_preEnd__revision;
    uStack_17f0 = 0;
    local_1808 = ColladaParserAutoGen15Private::_freeAttributes__revision;
    uStack_1800 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_17a8,0x9ad970,0,0x9bb9d0,0,0x9bba10,0x9ad9a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_17a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_17a8._88_8_;
    pmVar2->validateEndFunction = local_17a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_17a8._72_8_;
    pmVar2->validateBeginFunction = local_17a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_17a8._56_8_;
    pmVar2->endFunction = local_17a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_17a8._40_8_;
    pmVar2->textDataFunction = local_17a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_17a8._24_8_;
    pmVar2->beginFunction = local_17a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_17a8._8_8_;
    local_1878 = ColladaParserAutoGen15Private::_begin__subject;
    local_1870 = 0;
    local_1888 = ColladaParserAutoGen15Private::_data__subject;
    local_1880 = 0;
    local_1898 = ColladaParserAutoGen15Private::_end__subject;
    uStack_1890 = 0;
    local_18a8 = ColladaParserAutoGen15Private::_preBegin__subject;
    uStack_18a0 = 0;
    local_18b8 = ColladaParserAutoGen15Private::_preEnd__subject;
    uStack_18b0 = 0;
    local_18c8 = ColladaParserAutoGen15Private::_freeAttributes__subject;
    uStack_18c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1868,0x9ad9c0,0,0x9bba50,0,0x9bba90,0x9ad9f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1868.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1868._88_8_;
    pmVar2->validateEndFunction = local_1868.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1868._72_8_;
    pmVar2->validateBeginFunction = local_1868.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1868._56_8_;
    pmVar2->endFunction = local_1868.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1868._40_8_;
    pmVar2->textDataFunction = local_1868.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1868._24_8_;
    pmVar2->beginFunction = local_1868.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1868._8_8_;
    local_1938 = ColladaParserAutoGen15Private::_begin__title;
    local_1930 = 0;
    local_1948 = ColladaParserAutoGen15Private::_data__title;
    local_1940 = 0;
    local_1958 = ColladaParserAutoGen15Private::_end__title;
    uStack_1950 = 0;
    local_1968 = ColladaParserAutoGen15Private::_preBegin__title;
    uStack_1960 = 0;
    local_1978 = ColladaParserAutoGen15Private::_preEnd__title;
    uStack_1970 = 0;
    local_1988 = ColladaParserAutoGen15Private::_freeAttributes__title;
    uStack_1980 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1928,0x9ada10,0,0x9bbad0,0,0x9bbb10,0x9ada40);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1928.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1928._88_8_;
    pmVar2->validateEndFunction = local_1928.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1928._72_8_;
    pmVar2->validateBeginFunction = local_1928.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1928._56_8_;
    pmVar2->endFunction = local_1928.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1928._40_8_;
    pmVar2->textDataFunction = local_1928.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1928._24_8_;
    pmVar2->beginFunction = local_1928.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1928._8_8_;
    local_19f8 = ColladaParserAutoGen15Private::_begin__unit;
    local_19f0 = 0;
    local_1a08 = ColladaParserAutoGen15Private::_data__unit;
    local_1a00 = 0;
    local_1a18 = ColladaParserAutoGen15Private::_end__unit;
    uStack_1a10 = 0;
    local_1a28 = ColladaParserAutoGen15Private::_preBegin__unit;
    uStack_1a20 = 0;
    local_1a38 = ColladaParserAutoGen15Private::_preEnd__unit;
    uStack_1a30 = 0;
    local_1a48 = ColladaParserAutoGen15Private::_freeAttributes__unit;
    uStack_1a40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_19e8,0x9ada60,0,0x9bbb50,0,0x9bbb70,0x9ada90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_19e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_19e8._88_8_;
    pmVar2->validateEndFunction = local_19e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_19e8._72_8_;
    pmVar2->validateBeginFunction = local_19e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_19e8._56_8_;
    pmVar2->endFunction = local_19e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_19e8._40_8_;
    pmVar2->textDataFunction = local_19e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_19e8._24_8_;
    pmVar2->beginFunction = local_19e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_19e8._8_8_;
    local_1ab8 = ColladaParserAutoGen15Private::_begin__up_axis;
    local_1ab0 = 0;
    local_1ac8 = ColladaParserAutoGen15Private::_data__up_axis;
    local_1ac0 = 0;
    local_1ad8 = ColladaParserAutoGen15Private::_end__up_axis;
    uStack_1ad0 = 0;
    local_1ae8 = ColladaParserAutoGen15Private::_preBegin__up_axis;
    uStack_1ae0 = 0;
    local_1af8 = ColladaParserAutoGen15Private::_preEnd__up_axis;
    uStack_1af0 = 0;
    local_1b08 = ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    uStack_1b00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1aa8,0x9adab0,0,0x9bbd20,0,0x9bbe30,0x9adae0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1aa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1aa8._88_8_;
    pmVar2->validateEndFunction = local_1aa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1aa8._72_8_;
    pmVar2->validateBeginFunction = local_1aa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1aa8._56_8_;
    pmVar2->endFunction = local_1aa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1aa8._40_8_;
    pmVar2->textDataFunction = local_1aa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1aa8._24_8_;
    pmVar2->beginFunction = local_1aa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1aa8._8_8_;
    local_1b78 = ColladaParserAutoGen15Private::_begin__asset;
    local_1b70 = 0;
    local_1b88 = ColladaParserAutoGen15Private::_data__asset;
    local_1b80 = 0;
    local_1b98 = ColladaParserAutoGen15Private::_end__asset;
    uStack_1b90 = 0;
    local_1ba8 = ColladaParserAutoGen15Private::_preBegin__asset;
    uStack_1ba0 = 0;
    local_1bb8 = ColladaParserAutoGen15Private::_preEnd__asset;
    uStack_1bb0 = 0;
    local_1bc8 = ColladaParserAutoGen15Private::_freeAttributes__asset;
    uStack_1bc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1b68,0x9a9ff0,0,0x9ba3d0,0,0x9ba3f0,0x9aa020);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_1b68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1b68._88_8_;
    pmVar2->validateEndFunction = local_1b68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1b68._72_8_;
    pmVar2->validateBeginFunction = local_1b68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1b68._56_8_;
    pmVar2->endFunction = local_1b68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1b68._40_8_;
    pmVar2->textDataFunction = local_1b68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1b68._24_8_;
    pmVar2->beginFunction = local_1b68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1b68._8_8_;
    local_1c38 = ColladaParserAutoGen15Private::_begin__extra;
    local_1c30 = 0;
    local_1c48 = ColladaParserAutoGen15Private::_data__extra;
    local_1c40 = 0;
    local_1c58 = ColladaParserAutoGen15Private::_end__extra;
    uStack_1c50 = 0;
    local_1c68 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_1c60 = 0;
    local_1c78 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_1c70 = 0;
    local_1c88 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_1c80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_1c28,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1c28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1c28._88_8_;
    pmVar2->validateEndFunction = local_1c28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1c28._72_8_;
    pmVar2->validateBeginFunction = local_1c28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1c28._56_8_;
    pmVar2->endFunction = local_1c28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1c28._40_8_;
    pmVar2->textDataFunction = local_1c28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1c28._24_8_;
    pmVar2->beginFunction = local_1c28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1c28._8_8_;
    local_1cf8 = ColladaParserAutoGen15Private::_begin__instance_camera;
    local_1cf0 = 0;
    local_1d08 = ColladaParserAutoGen15Private::_data__instance_camera;
    local_1d00 = 0;
    local_1d18 = ColladaParserAutoGen15Private::_end__instance_camera;
    uStack_1d10 = 0;
    local_1d28 = ColladaParserAutoGen15Private::_preBegin__instance_camera;
    uStack_1d20 = 0;
    local_1d38 = ColladaParserAutoGen15Private::_preEnd__instance_camera;
    uStack_1d30 = 0;
    local_1d48 = ColladaParserAutoGen15Private::_freeAttributes__instance_camera;
    uStack_1d40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1ce8,0x9ab5d0,0,0xa02c90,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab600);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1ce8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1ce8._88_8_;
    pmVar2->validateEndFunction = local_1ce8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1ce8._72_8_;
    pmVar2->validateBeginFunction = local_1ce8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1ce8._56_8_;
    pmVar2->endFunction = local_1ce8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1ce8._40_8_;
    pmVar2->textDataFunction = local_1ce8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1ce8._24_8_;
    pmVar2->beginFunction = local_1ce8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1ce8._8_8_;
    local_1db8 = ColladaParserAutoGen15Private::_begin__instance_controller;
    local_1db0 = 0;
    local_1dc8 = ColladaParserAutoGen15Private::_data__instance_controller;
    local_1dc0 = 0;
    local_1dd8 = ColladaParserAutoGen15Private::_end__instance_controller;
    uStack_1dd0 = 0;
    local_1de8 = ColladaParserAutoGen15Private::_preBegin__instance_controller;
    uStack_1de0 = 0;
    local_1df8 = ColladaParserAutoGen15Private::_preEnd__instance_controller;
    uStack_1df0 = 0;
    local_1e08 = ColladaParserAutoGen15Private::_freeAttributes__instance_controller;
    uStack_1e00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1da8,0x9ab620,0,0xa03040,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab650);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1da8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1da8._88_8_;
    pmVar2->validateEndFunction = local_1da8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1da8._72_8_;
    pmVar2->validateBeginFunction = local_1da8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1da8._56_8_;
    pmVar2->endFunction = local_1da8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1da8._40_8_;
    pmVar2->textDataFunction = local_1da8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1da8._24_8_;
    pmVar2->beginFunction = local_1da8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1da8._8_8_;
    local_1e78 = ColladaParserAutoGen15Private::_begin__instance_geometry;
    local_1e70 = 0;
    local_1e88 = ColladaParserAutoGen15Private::_data__instance_geometry;
    local_1e80 = 0;
    local_1e98 = ColladaParserAutoGen15Private::_end__instance_geometry;
    uStack_1e90 = 0;
    local_1ea8 = ColladaParserAutoGen15Private::_preBegin__instance_geometry;
    uStack_1ea0 = 0;
    local_1eb8 = ColladaParserAutoGen15Private::_preEnd__instance_geometry;
    uStack_1eb0 = 0;
    local_1ec8 = ColladaParserAutoGen15Private::_freeAttributes__instance_geometry;
    uStack_1ec0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1e68,0x9ab760,0,0xa04050,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab790);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1e68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e68._88_8_;
    pmVar2->validateEndFunction = local_1e68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e68._72_8_;
    pmVar2->validateBeginFunction = local_1e68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e68._56_8_;
    pmVar2->endFunction = local_1e68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e68._40_8_;
    pmVar2->textDataFunction = local_1e68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e68._24_8_;
    pmVar2->beginFunction = local_1e68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e68._8_8_;
    local_1f38 = ColladaParserAutoGen15Private::_begin__instance_light;
    local_1f30 = 0;
    local_1f48 = ColladaParserAutoGen15Private::_data__instance_light;
    local_1f40 = 0;
    local_1f58 = ColladaParserAutoGen15Private::_end__instance_light;
    uStack_1f50 = 0;
    local_1f68 = ColladaParserAutoGen15Private::_preBegin__instance_light;
    uStack_1f60 = 0;
    local_1f78 = ColladaParserAutoGen15Private::_preEnd__instance_light;
    uStack_1f70 = 0;
    local_1f88 = ColladaParserAutoGen15Private::_freeAttributes__instance_light;
    uStack_1f80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1f28,0x9ab8f0,0,0xa04400,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab920);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1f28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1f28._88_8_;
    pmVar2->validateEndFunction = local_1f28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1f28._72_8_;
    pmVar2->validateBeginFunction = local_1f28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1f28._56_8_;
    pmVar2->endFunction = local_1f28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1f28._40_8_;
    pmVar2->textDataFunction = local_1f28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1f28._24_8_;
    pmVar2->beginFunction = local_1f28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1f28._8_8_;
    local_1ff8 = ColladaParserAutoGen15Private::_begin__instance_node;
    local_1ff0 = 0;
    local_2008 = ColladaParserAutoGen15Private::_data__instance_node;
    local_2000 = 0;
    local_2018 = ColladaParserAutoGen15Private::_end__instance_node;
    uStack_2010 = 0;
    local_2028 = ColladaParserAutoGen15Private::_preBegin__instance_node;
    uStack_2020 = 0;
    local_2038 = ColladaParserAutoGen15Private::_preEnd__instance_node;
    uStack_2030 = 0;
    local_2048 = ColladaParserAutoGen15Private::_freeAttributes__instance_node;
    uStack_2040 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_1fe8,0x9ab990,0,0xa047b0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab9c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_1fe8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1fe8._88_8_;
    pmVar2->validateEndFunction = local_1fe8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1fe8._72_8_;
    pmVar2->validateBeginFunction = local_1fe8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1fe8._56_8_;
    pmVar2->endFunction = local_1fe8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1fe8._40_8_;
    pmVar2->textDataFunction = local_1fe8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1fe8._24_8_;
    pmVar2->beginFunction = local_1fe8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1fe8._8_8_;
    local_20b8 = ColladaParserAutoGen15Private::_begin__lookat;
    local_20b0 = 0;
    local_20c8 = ColladaParserAutoGen15Private::_data__lookat;
    local_20c0 = 0;
    local_20d8 = ColladaParserAutoGen15Private::_end__lookat;
    uStack_20d0 = 0;
    local_20e8 = ColladaParserAutoGen15Private::_preBegin__lookat;
    uStack_20e0 = 0;
    local_20f8 = ColladaParserAutoGen15Private::_preEnd__lookat;
    uStack_20f0 = 0;
    local_2108 = ColladaParserAutoGen15Private::_freeAttributes__lookat;
    uStack_2100 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_20a8,0x9b8690,0,0xa02210,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b86c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_20a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_20a8._88_8_;
    pmVar2->validateEndFunction = local_20a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_20a8._72_8_;
    pmVar2->validateBeginFunction = local_20a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_20a8._56_8_;
    pmVar2->endFunction = local_20a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_20a8._40_8_;
    pmVar2->textDataFunction = local_20a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_20a8._24_8_;
    pmVar2->beginFunction = local_20a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_20a8._8_8_;
    local_2178 = ColladaParserAutoGen15Private::_begin__matrix____matrix_type;
    local_2170 = 0;
    local_2188 = ColladaParserAutoGen15Private::_data__matrix____matrix_type;
    local_2180 = 0;
    local_2198 = ColladaParserAutoGen15Private::_end__matrix____matrix_type;
    uStack_2190 = 0;
    local_21a8 = ColladaParserAutoGen15Private::_preBegin__matrix____matrix_type;
    uStack_21a0 = 0;
    local_21b8 = ColladaParserAutoGen15Private::_preEnd__matrix____matrix_type;
    uStack_21b0 = 0;
    local_21c8 = ColladaParserAutoGen15Private::_freeAttributes__matrix____matrix_type;
    uStack_21c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2168,0x9b86e0,0,0xa023d0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8710);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__node;
    pmVar2->freeAttributesFunction = local_2168.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2168._88_8_;
    pmVar2->validateEndFunction = local_2168.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2168._72_8_;
    pmVar2->validateBeginFunction = local_2168.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2168._56_8_;
    pmVar2->endFunction = local_2168.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2168._40_8_;
    pmVar2->textDataFunction = local_2168.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2168._24_8_;
    pmVar2->beginFunction = local_2168.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2168._8_8_;
    local_2238 = ColladaParserAutoGen15Private::_begin__node;
    local_2230 = 0;
    local_2248 = ColladaParserAutoGen15Private::_data__node;
    local_2240 = 0;
    local_2258 = ColladaParserAutoGen15Private::_end__node;
    uStack_2250 = 0;
    local_2268 = ColladaParserAutoGen15Private::_preBegin__node;
    uStack_2260 = 0;
    local_2278 = ColladaParserAutoGen15Private::_preEnd__node;
    uStack_2270 = 0;
    local_2288 = ColladaParserAutoGen15Private::_freeAttributes__node;
    uStack_2280 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2228,0x9ac070,0,0xa01d40,0,0xa01d60,0x9ac0a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2228.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2228._88_8_;
    pmVar2->validateEndFunction = local_2228.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2228._72_8_;
    pmVar2->validateBeginFunction = local_2228.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2228._56_8_;
    pmVar2->endFunction = local_2228.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2228._40_8_;
    pmVar2->textDataFunction = local_2228.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2228._24_8_;
    pmVar2->beginFunction = local_2228.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2228._8_8_;
    local_22f8 = ColladaParserAutoGen15Private::_begin__rotate;
    local_22f0 = 0;
    local_2308 = ColladaParserAutoGen15Private::_data__rotate;
    local_2300 = 0;
    local_2318 = ColladaParserAutoGen15Private::_end__rotate;
    uStack_2310 = 0;
    local_2328 = ColladaParserAutoGen15Private::_preBegin__rotate;
    uStack_2320 = 0;
    local_2338 = ColladaParserAutoGen15Private::_preEnd__rotate;
    uStack_2330 = 0;
    local_2348 = ColladaParserAutoGen15Private::_freeAttributes__rotate;
    uStack_2340 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_22e8,0x9b8730,0,0xa02590,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8760);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_22e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_22e8._88_8_;
    pmVar2->validateEndFunction = local_22e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_22e8._72_8_;
    pmVar2->validateBeginFunction = local_22e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_22e8._56_8_;
    pmVar2->endFunction = local_22e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_22e8._40_8_;
    pmVar2->textDataFunction = local_22e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_22e8._24_8_;
    pmVar2->beginFunction = local_22e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_22e8._8_8_;
    local_23b8 = ColladaParserAutoGen15Private::_begin__scale;
    local_23b0 = 0;
    local_23c8 = ColladaParserAutoGen15Private::_data__scale;
    local_23c0 = 0;
    local_23d8 = ColladaParserAutoGen15Private::_end__scale;
    uStack_23d0 = 0;
    local_23e8 = ColladaParserAutoGen15Private::_preBegin__scale;
    uStack_23e0 = 0;
    local_23f8 = ColladaParserAutoGen15Private::_preEnd__scale;
    uStack_23f0 = 0;
    local_2408 = ColladaParserAutoGen15Private::_freeAttributes__scale;
    uStack_2400 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_23a8,0x9b8780,0,0xa02750,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b87b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_23a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_23a8._88_8_;
    pmVar2->validateEndFunction = local_23a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_23a8._72_8_;
    pmVar2->validateBeginFunction = local_23a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_23a8._56_8_;
    pmVar2->endFunction = local_23a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_23a8._40_8_;
    pmVar2->textDataFunction = local_23a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_23a8._24_8_;
    pmVar2->beginFunction = local_23a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_23a8._8_8_;
    local_2478 = ColladaParserAutoGen15Private::_begin__skew;
    local_2470 = 0;
    local_2488 = ColladaParserAutoGen15Private::_data__skew;
    local_2480 = 0;
    local_2498 = ColladaParserAutoGen15Private::_end__skew;
    uStack_2490 = 0;
    local_24a8 = ColladaParserAutoGen15Private::_preBegin__skew;
    uStack_24a0 = 0;
    local_24b8 = ColladaParserAutoGen15Private::_preEnd__skew;
    uStack_24b0 = 0;
    local_24c8 = ColladaParserAutoGen15Private::_freeAttributes__skew;
    uStack_24c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2468,0x9b87d0,0,0xa02910,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8800);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2468.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2468._88_8_;
    pmVar2->validateEndFunction = local_2468.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2468._72_8_;
    pmVar2->validateBeginFunction = local_2468.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2468._56_8_;
    pmVar2->endFunction = local_2468.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2468._40_8_;
    pmVar2->textDataFunction = local_2468.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2468._24_8_;
    pmVar2->beginFunction = local_2468.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2468._8_8_;
    local_2538 = ColladaParserAutoGen15Private::_begin__translate;
    local_2530 = 0;
    local_2548 = ColladaParserAutoGen15Private::_data__translate;
    local_2540 = 0;
    local_2558 = ColladaParserAutoGen15Private::_end__translate;
    uStack_2550 = 0;
    local_2568 = ColladaParserAutoGen15Private::_preBegin__translate;
    uStack_2560 = 0;
    local_2578 = ColladaParserAutoGen15Private::_preEnd__translate;
    uStack_2570 = 0;
    local_2588 = ColladaParserAutoGen15Private::_freeAttributes__translate;
    uStack_2580 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2528,0x9b8820,0,0xa02ad0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8850);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_2528.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2528._88_8_;
    pmVar2->validateEndFunction = local_2528.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2528._72_8_;
    pmVar2->validateBeginFunction = local_2528.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2528._56_8_;
    pmVar2->endFunction = local_2528.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2528._40_8_;
    pmVar2->textDataFunction = local_2528.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2528._24_8_;
    pmVar2->beginFunction = local_2528.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2528._8_8_;
    local_25f8 = ColladaParserAutoGen15Private::_begin__extra;
    local_25f0 = 0;
    local_2608 = ColladaParserAutoGen15Private::_data__extra;
    local_2600 = 0;
    local_2618 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2610 = 0;
    local_2628 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_2620 = 0;
    local_2638 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_2630 = 0;
    local_2648 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_2640 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_25e8,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_25e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_25e8._88_8_;
    pmVar2->validateEndFunction = local_25e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_25e8._72_8_;
    pmVar2->validateBeginFunction = local_25e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_25e8._56_8_;
    pmVar2->endFunction = local_25e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_25e8._40_8_;
    pmVar2->textDataFunction = local_25e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_25e8._24_8_;
    pmVar2->beginFunction = local_25e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_25e8._8_8_;
    local_26b8 = ColladaParserAutoGen15Private::_begin__bind_material;
    local_26b0 = 0;
    local_26c8 = ColladaParserAutoGen15Private::_data__bind_material;
    local_26c0 = 0;
    local_26d8 = ColladaParserAutoGen15Private::_end__bind_material;
    uStack_26d0 = 0;
    local_26e8 = ColladaParserAutoGen15Private::_preBegin__bind_material;
    uStack_26e0 = 0;
    local_26f8 = ColladaParserAutoGen15Private::_preEnd__bind_material;
    uStack_26f0 = 0;
    local_2708 = ColladaParserAutoGen15Private::_freeAttributes__bind_material;
    uStack_2700 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_26a8,0x9aa9f0,0,0xa036d0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9aaa20);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_26a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_26a8._88_8_;
    pmVar2->validateEndFunction = local_26a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_26a8._72_8_;
    pmVar2->validateBeginFunction = local_26a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_26a8._56_8_;
    pmVar2->endFunction = local_26a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_26a8._40_8_;
    pmVar2->textDataFunction = local_26a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_26a8._24_8_;
    pmVar2->beginFunction = local_26a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_26a8._8_8_;
    local_2778 = ColladaParserAutoGen15Private::_begin__extra;
    local_2770 = 0;
    local_2788 = ColladaParserAutoGen15Private::_data__extra;
    local_2780 = 0;
    local_2798 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2790 = 0;
    local_27a8 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_27a0 = 0;
    local_27b8 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_27b0 = 0;
    local_27c8 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_27c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2768,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2768.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2768._88_8_;
    pmVar2->validateEndFunction = local_2768.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2768._72_8_;
    pmVar2->validateBeginFunction = local_2768.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2768._56_8_;
    pmVar2->endFunction = local_2768.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2768._40_8_;
    pmVar2->textDataFunction = local_2768.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2768._24_8_;
    pmVar2->beginFunction = local_2768.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2768._8_8_;
    local_2838 = ColladaParserAutoGen15Private::_begin__skeleton;
    local_2830 = 0;
    local_2848 = ColladaParserAutoGen15Private::_data__skeleton;
    local_2840 = 0;
    local_2858 = ColladaParserAutoGen15Private::_end__skeleton;
    uStack_2850 = 0;
    local_2868 = ColladaParserAutoGen15Private::_preBegin__skeleton;
    uStack_2860 = 0;
    local_2878 = ColladaParserAutoGen15Private::_preEnd__skeleton;
    uStack_2870 = 0;
    local_2888 = ColladaParserAutoGen15Private::_freeAttributes__skeleton;
    uStack_2880 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2828,0x9b8870,0,0xa033f0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b88a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_2828.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2828._88_8_;
    pmVar2->validateEndFunction = local_2828.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2828._72_8_;
    pmVar2->validateBeginFunction = local_2828.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2828._56_8_;
    pmVar2->endFunction = local_2828.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2828._40_8_;
    pmVar2->textDataFunction = local_2828.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2828._24_8_;
    pmVar2->beginFunction = local_2828.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2828._8_8_;
    local_28f8 = ColladaParserAutoGen15Private::_begin__extra;
    local_28f0 = 0;
    local_2908 = ColladaParserAutoGen15Private::_data__extra;
    local_2900 = 0;
    local_2918 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2910 = 0;
    local_2928 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_2920 = 0;
    local_2938 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_2930 = 0;
    local_2948 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_2940 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_28e8,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_28e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_28e8._88_8_;
    pmVar2->validateEndFunction = local_28e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_28e8._72_8_;
    pmVar2->validateBeginFunction = local_28e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_28e8._56_8_;
    pmVar2->endFunction = local_28e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_28e8._40_8_;
    pmVar2->textDataFunction = local_28e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_28e8._24_8_;
    pmVar2->beginFunction = local_28e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_28e8._8_8_;
    local_29b8 = ColladaParserAutoGen15Private::_begin__param____param_type;
    local_29b0 = 0;
    local_29c8 = ColladaParserAutoGen15Private::_data__param____param_type;
    local_29c0 = 0;
    local_29d8 = ColladaParserAutoGen15Private::_end__param____param_type;
    uStack_29d0 = 0;
    local_29e8 = ColladaParserAutoGen15Private::_preBegin__param____param_type;
    uStack_29e0 = 0;
    local_29f8 = ColladaParserAutoGen15Private::_preEnd__param____param_type;
    uStack_29f0 = 0;
    local_2a08 = ColladaParserAutoGen15Private::_freeAttributes__param____param_type;
    uStack_2a00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_29a8,0x9ae640,0,0x9be340,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ae670);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    pmVar2->freeAttributesFunction = local_29a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_29a8._88_8_;
    pmVar2->validateEndFunction = local_29a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_29a8._72_8_;
    pmVar2->validateBeginFunction = local_29a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_29a8._56_8_;
    pmVar2->endFunction = local_29a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_29a8._40_8_;
    pmVar2->textDataFunction = local_29a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_29a8._24_8_;
    pmVar2->beginFunction = local_29a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_29a8._8_8_;
    local_2a78 = ColladaParserAutoGen15Private::_begin__technique____technique_type;
    local_2a70 = 0;
    local_2a88 = ColladaParserAutoGen15Private::_data__technique____technique_type;
    local_2a80 = 0;
    local_2a98 = ColladaParserAutoGen15Private::_end__technique____technique_type;
    uStack_2a90 = 0;
    local_2aa8 = ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    uStack_2aa0 = 0;
    local_2ab8 = ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    uStack_2ab0 = 0;
    local_2ac8 = ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    uStack_2ac0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2a68,0x9ade70,0,0x9bc2b0,0,0x9bc2d0,0x9adea0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2a68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a68._88_8_;
    pmVar2->validateEndFunction = local_2a68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a68._72_8_;
    pmVar2->validateBeginFunction = local_2a68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a68._56_8_;
    pmVar2->endFunction = local_2a68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a68._40_8_;
    pmVar2->textDataFunction = local_2a68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a68._24_8_;
    pmVar2->beginFunction = local_2a68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a68._8_8_;
    local_2b38 = ColladaParserAutoGen15Private::_begin__bind_material_type____technique_common;
    local_2b30 = 0;
    local_2b48 = ColladaParserAutoGen15Private::_data__bind_material_type____technique_common;
    local_2b40 = 0;
    local_2b58 = ColladaParserAutoGen15Private::_end__bind_material_type____technique_common;
    uStack_2b50 = 0;
    local_2b68 = ColladaParserAutoGen15Private::_preBegin__bind_material_type____technique_common;
    uStack_2b60 = 0;
    local_2b78 = ColladaParserAutoGen15Private::_preEnd__bind_material_type____technique_common;
    uStack_2b70 = 0;
    local_2b88 = ColladaParserAutoGen15Private::
                 _freeAttributes__bind_material_type____technique_common;
    uStack_2b80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2b28,0x9b88c0,0,0xa03730,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b88f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2b28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2b28._88_8_;
    pmVar2->validateEndFunction = local_2b28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2b28._72_8_;
    pmVar2->validateBeginFunction = local_2b28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2b28._56_8_;
    pmVar2->endFunction = local_2b28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2b28._40_8_;
    pmVar2->textDataFunction = local_2b28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2b28._24_8_;
    pmVar2->beginFunction = local_2b28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2b28._8_8_;
    local_2bf8 = ColladaParserAutoGen15Private::_begin__instance_material____instance_material_type;
    local_2bf0 = 0;
    local_2c08 = ColladaParserAutoGen15Private::_data__instance_material____instance_material_type;
    local_2c00 = 0;
    local_2c18 = ColladaParserAutoGen15Private::_end__instance_material____instance_material_type;
    uStack_2c10 = 0;
    local_2c28 = ColladaParserAutoGen15Private::
                 _preBegin__instance_material____instance_material_type;
    uStack_2c20 = 0;
    local_2c38 = ColladaParserAutoGen15Private::_preEnd__instance_material____instance_material_type
    ;
    uStack_2c30 = 0;
    local_2c48 = ColladaParserAutoGen15Private::
                 _freeAttributes__instance_material____instance_material_type;
    uStack_2c40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2be8,0x9ab940,0,0xa03790,0,(ElementValidateEndFunctionPtr)pcVar3,0x9ab970);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2be8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2be8._88_8_;
    pmVar2->validateEndFunction = local_2be8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2be8._72_8_;
    pmVar2->validateBeginFunction = local_2be8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2be8._56_8_;
    pmVar2->endFunction = local_2be8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2be8._40_8_;
    pmVar2->textDataFunction = local_2be8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2be8._24_8_;
    pmVar2->beginFunction = local_2be8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2be8._8_8_;
    local_2cb8 = ColladaParserAutoGen15Private::_begin__instance_material_type____bind;
    local_2cb0 = 0;
    local_2cc8 = ColladaParserAutoGen15Private::_data__instance_material_type____bind;
    local_2cc0 = 0;
    local_2cd8 = ColladaParserAutoGen15Private::_end__instance_material_type____bind;
    uStack_2cd0 = 0;
    local_2ce8 = ColladaParserAutoGen15Private::_preBegin__instance_material_type____bind;
    uStack_2ce0 = 0;
    local_2cf8 = ColladaParserAutoGen15Private::_preEnd__instance_material_type____bind;
    uStack_2cf0 = 0;
    local_2d08 = ColladaParserAutoGen15Private::_freeAttributes__instance_material_type____bind;
    uStack_2d00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2ca8,0x9b8910,0,0xa03bb0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8940);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2ca8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2ca8._88_8_;
    pmVar2->validateEndFunction = local_2ca8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2ca8._72_8_;
    pmVar2->validateBeginFunction = local_2ca8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2ca8._56_8_;
    pmVar2->endFunction = local_2ca8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2ca8._40_8_;
    pmVar2->textDataFunction = local_2ca8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2ca8._24_8_;
    pmVar2->beginFunction = local_2ca8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2ca8._8_8_;
    local_2d78 = ColladaParserAutoGen15Private::_begin__bind_vertex_input;
    local_2d70 = 0;
    local_2d88 = ColladaParserAutoGen15Private::_data__bind_vertex_input;
    local_2d80 = 0;
    local_2d98 = ColladaParserAutoGen15Private::_end__bind_vertex_input;
    uStack_2d90 = 0;
    local_2da8 = ColladaParserAutoGen15Private::_preBegin__bind_vertex_input;
    uStack_2da0 = 0;
    local_2db8 = ColladaParserAutoGen15Private::_preEnd__bind_vertex_input;
    uStack_2db0 = 0;
    local_2dc8 = ColladaParserAutoGen15Private::_freeAttributes__bind_vertex_input;
    uStack_2dc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct
              (&local_2d68,0x9b8960,0,0xa03dc0,0,(ElementValidateEndFunctionPtr)pcVar3,0x9b8990);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2d68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2d68._88_8_;
    pmVar2->validateEndFunction = local_2d68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2d68._72_8_;
    pmVar2->validateBeginFunction = local_2d68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2d68._56_8_;
    pmVar2->endFunction = local_2d68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2d68._40_8_;
    pmVar2->textDataFunction = local_2d68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2d68._24_8_;
    pmVar2->beginFunction = local_2d68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2d68._8_8_;
    local_2e38 = ColladaParserAutoGen15Private::_begin__extra;
    local_2e30 = 0;
    local_2e48 = ColladaParserAutoGen15Private::_data__extra;
    local_2e40 = 0;
    local_2e58 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2e50 = 0;
    local_2e68 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_2e60 = 0;
    local_2e78 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_2e70 = 0;
    local_2e88 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_2e80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2e28,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2e28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2e28._88_8_;
    pmVar2->validateEndFunction = local_2e28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2e28._72_8_;
    pmVar2->validateBeginFunction = local_2e28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2e28._56_8_;
    pmVar2->endFunction = local_2e28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2e28._40_8_;
    pmVar2->textDataFunction = local_2e28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2e28._24_8_;
    pmVar2->beginFunction = local_2e28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2e28._8_8_;
    local_2ef8 = ColladaParserAutoGen15Private::_begin__bind_material;
    local_2ef0 = 0;
    local_2f08 = ColladaParserAutoGen15Private::_data__bind_material;
    local_2f00 = 0;
    local_2f18 = ColladaParserAutoGen15Private::_end__bind_material;
    uStack_2f10 = 0;
    local_2f28 = ColladaParserAutoGen15Private::_preBegin__bind_material;
    uStack_2f20 = 0;
    local_2f38 = ColladaParserAutoGen15Private::_preEnd__bind_material;
    uStack_2f30 = 0;
    local_2f48 = ColladaParserAutoGen15Private::_freeAttributes__bind_material;
    uStack_2f40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2ee8,0x9aa9f0,0,0xa036d0,0,0xa036f0,0x9aaa20);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2ee8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2ee8._88_8_;
    pmVar2->validateEndFunction = local_2ee8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2ee8._72_8_;
    pmVar2->validateBeginFunction = local_2ee8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2ee8._56_8_;
    pmVar2->endFunction = local_2ee8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2ee8._40_8_;
    pmVar2->textDataFunction = local_2ee8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2ee8._24_8_;
    pmVar2->beginFunction = local_2ee8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2ee8._8_8_;
    local_2fb8 = ColladaParserAutoGen15Private::_begin__extra;
    local_2fb0 = 0;
    local_2fc8 = ColladaParserAutoGen15Private::_data__extra;
    local_2fc0 = 0;
    local_2fd8 = ColladaParserAutoGen15Private::_end__extra;
    uStack_2fd0 = 0;
    local_2fe8 = ColladaParserAutoGen15Private::_preBegin__extra;
    uStack_2fe0 = 0;
    local_2ff8 = ColladaParserAutoGen15Private::_preEnd__extra;
    uStack_2ff0 = 0;
    local_3008 = ColladaParserAutoGen15Private::_freeAttributes__extra;
    uStack_3000 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_2fa8,0x9aa040,0,0x9bc100,0,0x9bc120,0x9aa070);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2fa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2fa8._88_8_;
    pmVar2->validateEndFunction = local_2fa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2fa8._72_8_;
    pmVar2->validateBeginFunction = local_2fa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2fa8._56_8_;
    pmVar2->endFunction = local_2fa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2fa8._40_8_;
    pmVar2->textDataFunction = local_2fa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2fa8._24_8_;
    pmVar2->beginFunction = local_2fa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2fa8._8_8_;
    local_3078 = ColladaParserAutoGen15Private::_begin__rotate;
    local_3070 = 0;
    local_3088 = ColladaParserAutoGen15Private::_data__rotate;
    local_3080 = 0;
    local_3098 = ColladaParserAutoGen15Private::_end__rotate;
    uStack_3090 = 0;
    local_30a8 = ColladaParserAutoGen15Private::_preBegin__rotate;
    uStack_30a0 = 0;
    local_30b8 = ColladaParserAutoGen15Private::_preEnd__rotate;
    uStack_30b0 = 0;
    local_30c8 = ColladaParserAutoGen15Private::_freeAttributes__rotate;
    uStack_30c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_3068,0x9b8730,0,0xa02590,0,0xa025e0,0x9b8760);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3068.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3068._88_8_;
    pmVar2->validateEndFunction = local_3068.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3068._72_8_;
    pmVar2->validateBeginFunction = local_3068.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3068._56_8_;
    pmVar2->endFunction = local_3068.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3068._40_8_;
    pmVar2->textDataFunction = local_3068.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3068._24_8_;
    pmVar2->beginFunction = local_3068.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3068._8_8_;
    local_3138 = ColladaParserAutoGen15Private::_begin__scale;
    local_3130 = 0;
    local_3148 = ColladaParserAutoGen15Private::_data__scale;
    local_3140 = 0;
    local_3158 = ColladaParserAutoGen15Private::_end__scale;
    uStack_3150 = 0;
    local_3168 = ColladaParserAutoGen15Private::_preBegin__scale;
    uStack_3160 = 0;
    local_3178 = ColladaParserAutoGen15Private::_preEnd__scale;
    uStack_3170 = 0;
    local_3188 = ColladaParserAutoGen15Private::_freeAttributes__scale;
    uStack_3180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_3128,0x9b8780,0,0xa02750,0,0xa027a0,0x9b87b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3128._88_8_;
    pmVar2->validateEndFunction = local_3128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3128._72_8_;
    pmVar2->validateBeginFunction = local_3128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3128._56_8_;
    pmVar2->endFunction = local_3128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3128._40_8_;
    pmVar2->textDataFunction = local_3128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3128._24_8_;
    pmVar2->beginFunction = local_3128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3128._8_8_;
    local_31f8 = ColladaParserAutoGen15Private::_begin__skew;
    local_31f0 = 0;
    local_3208 = ColladaParserAutoGen15Private::_data__skew;
    local_3200 = 0;
    local_3218 = ColladaParserAutoGen15Private::_end__skew;
    uStack_3210 = 0;
    local_3228 = ColladaParserAutoGen15Private::_preBegin__skew;
    uStack_3220 = 0;
    local_3238 = ColladaParserAutoGen15Private::_preEnd__skew;
    uStack_3230 = 0;
    local_3248 = ColladaParserAutoGen15Private::_freeAttributes__skew;
    uStack_3240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_31e8,0x9b87d0,0,0xa02910,0,0xa02960,0x9b8800);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_31e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_31e8._88_8_;
    pmVar2->validateEndFunction = local_31e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_31e8._72_8_;
    pmVar2->validateBeginFunction = local_31e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_31e8._56_8_;
    pmVar2->endFunction = local_31e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_31e8._40_8_;
    pmVar2->textDataFunction = local_31e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_31e8._24_8_;
    pmVar2->beginFunction = local_31e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_31e8._8_8_;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::FunctionStruct::FunctionStruct(&local_32a8,0x9b8820,0,0xa02ad0,0,0xa02c70,0x9b8850);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    memcpy(pmVar2,&local_32a8,0x60);
    createFunctionMap__library_nodes__allChildren::mapFilled = true;
  }
  return &createFunctionMap__library_nodes__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen15Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_nodes__allChildren() {
static ColladaParserAutoGen15Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__COLLADA, &ColladaParserAutoGen15Private::_data__COLLADA, &ColladaParserAutoGen15Private::_end__COLLADA, &ColladaParserAutoGen15Private::_preBegin__COLLADA, &ColladaParserAutoGen15Private::_preEnd__COLLADA, &ColladaParserAutoGen15Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_NODES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_nodes, &ColladaParserAutoGen15Private::_data__library_nodes, &ColladaParserAutoGen15Private::_end__library_nodes, &ColladaParserAutoGen15Private::_preBegin__library_nodes, &ColladaParserAutoGen15Private::_preEnd__library_nodes, &ColladaParserAutoGen15Private::_freeAttributes__library_nodes);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_NODE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__node, &ColladaParserAutoGen15Private::_data__node, &ColladaParserAutoGen15Private::_end__node, &ColladaParserAutoGen15Private::_preBegin__node, &ColladaParserAutoGen15Private::_preEnd__node, &ColladaParserAutoGen15Private::_freeAttributes__node);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__contributor, &ColladaParserAutoGen15Private::_data__contributor, &ColladaParserAutoGen15Private::_end__contributor, &ColladaParserAutoGen15Private::_preBegin__contributor, &ColladaParserAutoGen15Private::_preEnd__contributor, &ColladaParserAutoGen15Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_COVERAGE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__coverage, &ColladaParserAutoGen15Private::_data__coverage, &ColladaParserAutoGen15Private::_end__coverage, &ColladaParserAutoGen15Private::_preBegin__coverage, &ColladaParserAutoGen15Private::_preEnd__coverage, &ColladaParserAutoGen15Private::_freeAttributes__coverage);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__created, &ColladaParserAutoGen15Private::_data__created, &ColladaParserAutoGen15Private::_end__created, &ColladaParserAutoGen15Private::_preBegin__created, &ColladaParserAutoGen15Private::_preEnd__created, &ColladaParserAutoGen15Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author, &ColladaParserAutoGen15Private::_data__author, &ColladaParserAutoGen15Private::_end__author, &ColladaParserAutoGen15Private::_preBegin__author, &ColladaParserAutoGen15Private::_preEnd__author, &ColladaParserAutoGen15Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHOR_EMAIL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_email, &ColladaParserAutoGen15Private::_data__author_email, &ColladaParserAutoGen15Private::_end__author_email, &ColladaParserAutoGen15Private::_preBegin__author_email, &ColladaParserAutoGen15Private::_preEnd__author_email, &ColladaParserAutoGen15Private::_freeAttributes__author_email);
functionMap[HASH_ELEMENT_AUTHOR_WEBSITE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_website, &ColladaParserAutoGen15Private::_data__author_website, &ColladaParserAutoGen15Private::_end__author_website, &ColladaParserAutoGen15Private::_preBegin__author_website, &ColladaParserAutoGen15Private::_preEnd__author_website, &ColladaParserAutoGen15Private::_freeAttributes__author_website);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__authoring_tool, &ColladaParserAutoGen15Private::_data__authoring_tool, &ColladaParserAutoGen15Private::_end__authoring_tool, &ColladaParserAutoGen15Private::_preBegin__authoring_tool, &ColladaParserAutoGen15Private::_preEnd__authoring_tool, &ColladaParserAutoGen15Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__comments, &ColladaParserAutoGen15Private::_data__comments, &ColladaParserAutoGen15Private::_end__comments, &ColladaParserAutoGen15Private::_preBegin__comments, &ColladaParserAutoGen15Private::_preEnd__comments, &ColladaParserAutoGen15Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__copyright, &ColladaParserAutoGen15Private::_data__copyright, &ColladaParserAutoGen15Private::_end__copyright, &ColladaParserAutoGen15Private::_preBegin__copyright, &ColladaParserAutoGen15Private::_preEnd__copyright, &ColladaParserAutoGen15Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_data, &ColladaParserAutoGen15Private::_data__source_data, &ColladaParserAutoGen15Private::_end__source_data, &ColladaParserAutoGen15Private::_preBegin__source_data, &ColladaParserAutoGen15Private::_preEnd__source_data, &ColladaParserAutoGen15Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_GEOGRAPHIC_LOCATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__geographic_location, &ColladaParserAutoGen15Private::_data__geographic_location, &ColladaParserAutoGen15Private::_end__geographic_location, &ColladaParserAutoGen15Private::_preBegin__geographic_location, &ColladaParserAutoGen15Private::_preEnd__geographic_location, &ColladaParserAutoGen15Private::_freeAttributes__geographic_location);
functionMap[HASH_ELEMENT_ALTITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__altitude, &ColladaParserAutoGen15Private::_data__altitude, &ColladaParserAutoGen15Private::_end__altitude, &ColladaParserAutoGen15Private::_preBegin__altitude, &ColladaParserAutoGen15Private::_preEnd__altitude, &ColladaParserAutoGen15Private::_freeAttributes__altitude);
functionMap[HASH_ELEMENT_LATITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__latitude, &ColladaParserAutoGen15Private::_data__latitude, &ColladaParserAutoGen15Private::_end__latitude, &ColladaParserAutoGen15Private::_preBegin__latitude, &ColladaParserAutoGen15Private::_preEnd__latitude, &ColladaParserAutoGen15Private::_freeAttributes__latitude);
functionMap[HASH_ELEMENT_LONGITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__longitude, &ColladaParserAutoGen15Private::_data__longitude, &ColladaParserAutoGen15Private::_end__longitude, &ColladaParserAutoGen15Private::_preBegin__longitude, &ColladaParserAutoGen15Private::_preEnd__longitude, &ColladaParserAutoGen15Private::_freeAttributes__longitude);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INSTANCE_CAMERA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_camera, &ColladaParserAutoGen15Private::_data__instance_camera, &ColladaParserAutoGen15Private::_end__instance_camera, &ColladaParserAutoGen15Private::_preBegin__instance_camera, &ColladaParserAutoGen15Private::_preEnd__instance_camera, &ColladaParserAutoGen15Private::_freeAttributes__instance_camera);
functionMap[HASH_ELEMENT_INSTANCE_CONTROLLER] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_controller, &ColladaParserAutoGen15Private::_data__instance_controller, &ColladaParserAutoGen15Private::_end__instance_controller, &ColladaParserAutoGen15Private::_preBegin__instance_controller, &ColladaParserAutoGen15Private::_preEnd__instance_controller, &ColladaParserAutoGen15Private::_freeAttributes__instance_controller);
functionMap[HASH_ELEMENT_INSTANCE_GEOMETRY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_geometry, &ColladaParserAutoGen15Private::_data__instance_geometry, &ColladaParserAutoGen15Private::_end__instance_geometry, &ColladaParserAutoGen15Private::_preBegin__instance_geometry, &ColladaParserAutoGen15Private::_preEnd__instance_geometry, &ColladaParserAutoGen15Private::_freeAttributes__instance_geometry);
functionMap[HASH_ELEMENT_INSTANCE_LIGHT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_light, &ColladaParserAutoGen15Private::_data__instance_light, &ColladaParserAutoGen15Private::_end__instance_light, &ColladaParserAutoGen15Private::_preBegin__instance_light, &ColladaParserAutoGen15Private::_preEnd__instance_light, &ColladaParserAutoGen15Private::_freeAttributes__instance_light);
functionMap[HASH_ELEMENT_INSTANCE_NODE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_node, &ColladaParserAutoGen15Private::_data__instance_node, &ColladaParserAutoGen15Private::_end__instance_node, &ColladaParserAutoGen15Private::_preBegin__instance_node, &ColladaParserAutoGen15Private::_preEnd__instance_node, &ColladaParserAutoGen15Private::_freeAttributes__instance_node);
functionMap[HASH_ELEMENT_LOOKAT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__lookat, &ColladaParserAutoGen15Private::_data__lookat, &ColladaParserAutoGen15Private::_end__lookat, &ColladaParserAutoGen15Private::_preBegin__lookat, &ColladaParserAutoGen15Private::_preEnd__lookat, &ColladaParserAutoGen15Private::_freeAttributes__lookat);
functionMap[HASH_ELEMENT_MATRIX____MATRIX_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__matrix____matrix_type, &ColladaParserAutoGen15Private::_data__matrix____matrix_type, &ColladaParserAutoGen15Private::_end__matrix____matrix_type, &ColladaParserAutoGen15Private::_preBegin__matrix____matrix_type, &ColladaParserAutoGen15Private::_preEnd__matrix____matrix_type, &ColladaParserAutoGen15Private::_freeAttributes__matrix____matrix_type);
functionMap[HASH_ELEMENT_NODE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__node, &ColladaParserAutoGen15Private::_data__node, &ColladaParserAutoGen15Private::_end__node, &ColladaParserAutoGen15Private::_preBegin__node, &ColladaParserAutoGen15Private::_preEnd__node, &ColladaParserAutoGen15Private::_freeAttributes__node);
functionMap[HASH_ELEMENT_ROTATE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__rotate, &ColladaParserAutoGen15Private::_data__rotate, &ColladaParserAutoGen15Private::_end__rotate, &ColladaParserAutoGen15Private::_preBegin__rotate, &ColladaParserAutoGen15Private::_preEnd__rotate, &ColladaParserAutoGen15Private::_freeAttributes__rotate);
functionMap[HASH_ELEMENT_SCALE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__scale, &ColladaParserAutoGen15Private::_data__scale, &ColladaParserAutoGen15Private::_end__scale, &ColladaParserAutoGen15Private::_preBegin__scale, &ColladaParserAutoGen15Private::_preEnd__scale, &ColladaParserAutoGen15Private::_freeAttributes__scale);
functionMap[HASH_ELEMENT_SKEW] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__skew, &ColladaParserAutoGen15Private::_data__skew, &ColladaParserAutoGen15Private::_end__skew, &ColladaParserAutoGen15Private::_preBegin__skew, &ColladaParserAutoGen15Private::_preEnd__skew, &ColladaParserAutoGen15Private::_freeAttributes__skew);
functionMap[HASH_ELEMENT_TRANSLATE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__translate, &ColladaParserAutoGen15Private::_data__translate, &ColladaParserAutoGen15Private::_end__translate, &ColladaParserAutoGen15Private::_preBegin__translate, &ColladaParserAutoGen15Private::_preEnd__translate, &ColladaParserAutoGen15Private::_freeAttributes__translate);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_BIND_MATERIAL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bind_material, &ColladaParserAutoGen15Private::_data__bind_material, &ColladaParserAutoGen15Private::_end__bind_material, &ColladaParserAutoGen15Private::_preBegin__bind_material, &ColladaParserAutoGen15Private::_preEnd__bind_material, &ColladaParserAutoGen15Private::_freeAttributes__bind_material);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SKELETON] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__skeleton, &ColladaParserAutoGen15Private::_data__skeleton, &ColladaParserAutoGen15Private::_end__skeleton, &ColladaParserAutoGen15Private::_preBegin__skeleton, &ColladaParserAutoGen15Private::_preEnd__skeleton, &ColladaParserAutoGen15Private::_freeAttributes__skeleton);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_PARAM____PARAM_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__param____param_type, &ColladaParserAutoGen15Private::_data__param____param_type, &ColladaParserAutoGen15Private::_end__param____param_type, &ColladaParserAutoGen15Private::_preBegin__param____param_type, &ColladaParserAutoGen15Private::_preEnd__param____param_type, &ColladaParserAutoGen15Private::_freeAttributes__param____param_type);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_BIND_MATERIAL_TYPE____TECHNIQUE_COMMON] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bind_material_type____technique_common, &ColladaParserAutoGen15Private::_data__bind_material_type____technique_common, &ColladaParserAutoGen15Private::_end__bind_material_type____technique_common, &ColladaParserAutoGen15Private::_preBegin__bind_material_type____technique_common, &ColladaParserAutoGen15Private::_preEnd__bind_material_type____technique_common, &ColladaParserAutoGen15Private::_freeAttributes__bind_material_type____technique_common);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL____INSTANCE_MATERIAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_material____instance_material_type, &ColladaParserAutoGen15Private::_data__instance_material____instance_material_type, &ColladaParserAutoGen15Private::_end__instance_material____instance_material_type, &ColladaParserAutoGen15Private::_preBegin__instance_material____instance_material_type, &ColladaParserAutoGen15Private::_preEnd__instance_material____instance_material_type, &ColladaParserAutoGen15Private::_freeAttributes__instance_material____instance_material_type);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL_TYPE____BIND] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__instance_material_type____bind, &ColladaParserAutoGen15Private::_data__instance_material_type____bind, &ColladaParserAutoGen15Private::_end__instance_material_type____bind, &ColladaParserAutoGen15Private::_preBegin__instance_material_type____bind, &ColladaParserAutoGen15Private::_preEnd__instance_material_type____bind, &ColladaParserAutoGen15Private::_freeAttributes__instance_material_type____bind);
functionMap[HASH_ELEMENT_BIND_VERTEX_INPUT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bind_vertex_input, &ColladaParserAutoGen15Private::_data__bind_vertex_input, &ColladaParserAutoGen15Private::_end__bind_vertex_input, &ColladaParserAutoGen15Private::_preBegin__bind_vertex_input, &ColladaParserAutoGen15Private::_preEnd__bind_vertex_input, &ColladaParserAutoGen15Private::_freeAttributes__bind_vertex_input);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_BIND_MATERIAL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bind_material, &ColladaParserAutoGen15Private::_data__bind_material, &ColladaParserAutoGen15Private::_end__bind_material, &ColladaParserAutoGen15Private::_preBegin__bind_material, &ColladaParserAutoGen15Private::_preEnd__bind_material, &ColladaParserAutoGen15Private::_freeAttributes__bind_material);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_ROTATE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__rotate, &ColladaParserAutoGen15Private::_data__rotate, &ColladaParserAutoGen15Private::_end__rotate, &ColladaParserAutoGen15Private::_preBegin__rotate, &ColladaParserAutoGen15Private::_preEnd__rotate, &ColladaParserAutoGen15Private::_freeAttributes__rotate);
functionMap[HASH_ELEMENT_SCALE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__scale, &ColladaParserAutoGen15Private::_data__scale, &ColladaParserAutoGen15Private::_end__scale, &ColladaParserAutoGen15Private::_preBegin__scale, &ColladaParserAutoGen15Private::_preEnd__scale, &ColladaParserAutoGen15Private::_freeAttributes__scale);
functionMap[HASH_ELEMENT_SKEW] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__skew, &ColladaParserAutoGen15Private::_data__skew, &ColladaParserAutoGen15Private::_end__skew, &ColladaParserAutoGen15Private::_preBegin__skew, &ColladaParserAutoGen15Private::_preEnd__skew, &ColladaParserAutoGen15Private::_freeAttributes__skew);
functionMap[HASH_ELEMENT_TRANSLATE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__translate, &ColladaParserAutoGen15Private::_data__translate, &ColladaParserAutoGen15Private::_end__translate, &ColladaParserAutoGen15Private::_preBegin__translate, &ColladaParserAutoGen15Private::_preEnd__translate, &ColladaParserAutoGen15Private::_freeAttributes__translate);
mapFilled = true;
}
return functionMap;
}